

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O2

void target_machinize(gen_ctx_t gen_ctx)

{
  long lVar1;
  int iVar2;
  undefined1 auVar3 [32];
  anon_union_32_12_57d33f68_for_u aVar4;
  undefined1 uVar5;
  char cVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  ushort uVar9;
  MIR_context_t ctx;
  long lVar10;
  MIR_insn_t pMVar11;
  VARR_MIR_var_t *varr;
  MIR_insn_t pMVar12;
  MIR_insn_t *ppMVar13;
  void *pvVar14;
  MIR_disp_t MVar15;
  MIR_disp_t MVar16;
  void *pvVar17;
  MIR_insn_t pMVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [24];
  anon_union_32_12_57d33f68_for_u aVar26;
  undefined8 uVar27;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  anon_union_32_12_57d33f68_for_u aVar34;
  undefined1 auVar35 [32];
  anon_union_32_12_57d33f68_for_u aVar36;
  undefined1 auVar37 [32];
  anon_union_32_12_57d33f68_for_u aVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  anon_union_32_12_57d33f68_for_u aVar43;
  undefined1 auVar44 [32];
  anon_union_32_12_57d33f68_for_u aVar45;
  undefined1 auVar46 [15];
  undefined1 auVar47 [16];
  MIR_error_type_t MVar48;
  undefined1 auVar49 [30];
  undefined4 uVar50;
  size_t sVar51;
  undefined1 (*pauVar52) [32];
  MIR_item_t pMVar53;
  undefined1 uVar54;
  MIR_item_t pMVar55;
  undefined8 uVar56;
  int iVar57;
  MIR_reg_t MVar58;
  MIR_reg_t MVar59;
  MIR_insn_code_t MVar60;
  MIR_insn_t_conflict pMVar61;
  MIR_insn_t pMVar62;
  size_t sVar63;
  MIR_insn_t_conflict pMVar64;
  MIR_item_t_conflict pMVar65;
  target_ctx *ptVar66;
  MIR_error_func_t p_Var67;
  uint uVar68;
  uint32_t narg;
  ulong uVar69;
  char *pcVar70;
  MIR_context_t ctx_00;
  MIR_reg_t base;
  int iVar71;
  ulong uVar72;
  MIR_type_t MVar73;
  MIR_type_t MVar74;
  uint uVar75;
  uint uVar76;
  MIR_type_t MVar77;
  int iVar78;
  MIR_op_t *pMVar79;
  int iVar80;
  MIR_func_t pMVar81;
  anon_union_32_12_57d33f68_for_u *paVar82;
  bool bVar83;
  MIR_insn_t local_ea0;
  ulong local_e98;
  MIR_disp_t local_e78;
  MIR_insn_code_t new_insn_code;
  MIR_item_t_conflict local_e68;
  MIR_insn_t local_e60;
  MIR_insn_code_t mov_code2;
  undefined4 uStack_e54;
  char cStack_e50;
  undefined1 uStack_e4f;
  undefined6 uStack_e4e;
  byte bStack_e48;
  undefined7 uStack_e47;
  char *pcStack_e40;
  MIR_reg_t local_e38;
  undefined4 uStack_e34;
  MIR_item_t local_e30;
  MIR_op_t temp_op;
  MIR_insn_t local_df8;
  size_t fp_arg_num_1;
  MIR_insn_code_t new_insn_code_1;
  ulong local_de0;
  size_t fp_arg_num;
  size_t int_arg_num;
  size_t int_arg_num_1;
  MIR_func_t local_dc0;
  MIR_op_t temp_op_1;
  ulong local_d78;
  ulong local_d60;
  MIR_op_t mem_op_1;
  MIR_op_t reg_op3;
  MIR_insn_code_t mov_code1;
  undefined4 uStack_cf4;
  char cStack_cf0;
  undefined7 uStack_cef;
  anon_union_32_12_57d33f68_for_u aStack_ce8;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 uStack_cb8;
  char *pcStack_cb0;
  undefined8 uStack_ca8;
  MIR_item_t pMStack_ca0;
  MIR_insn_t local_c98;
  undefined2 uStack_c90;
  undefined6 uStack_c8e;
  undefined2 uStack_c88;
  undefined6 uStack_c86;
  undefined2 uStack_c80;
  undefined6 uStack_c7e;
  undefined2 uStack_c78;
  undefined6 uStack_c76;
  undefined2 uStack_c70;
  undefined6 uStack_c6e;
  MIR_insn_t local_c68;
  ushort uStack_c60;
  undefined1 auStack_c5e [6];
  MIR_insn_t pMStack_c58;
  char *pcStack_c50;
  void *pvStack_c48;
  MIR_item_t pMStack_c40;
  MIR_insn_t local_c38;
  undefined2 uStack_c30;
  undefined4 uStack_c2e;
  undefined2 uStack_c2a;
  byte bStack_c28;
  undefined7 uStack_c27;
  char *pcStack_c20;
  undefined1 uStack_c18;
  undefined7 uStack_c17;
  MIR_item_t pMStack_c10;
  undefined1 auStack_c08 [16];
  undefined1 local_bf8 [16];
  undefined1 auStack_be8 [16];
  long local_bd0;
  undefined1 (*local_bc8) [32];
  ulong local_bc0;
  MIR_op_t local_bb8;
  MIR_op_t *local_b80;
  MIR_item_t func_import_item_1;
  undefined7 uStack_b70;
  undefined1 uStack_b69;
  anon_union_32_12_57d33f68_for_u aStack_b68;
  MIR_op_t dest_reg_op;
  undefined4 local_b18;
  undefined2 uStack_b14;
  MIR_item_t proto_item_1;
  undefined8 uStack_ae0;
  undefined8 uStack_ad8;
  undefined6 uStack_ad0;
  undefined2 uStack_aca;
  undefined6 uStack_ac8;
  MIR_insn_code_t mov_code2_2;
  undefined4 uStack_ab4;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  char *pcStack_aa0;
  undefined1 auStack_a98 [16];
  MIR_op_t ret_reg_op;
  MIR_item_t func_import_item;
  MIR_item_t proto_item;
  MIR_op_t mem_op;
  MIR_op_t arg_reg_op;
  MIR_var_t local_998;
  MIR_var_t local_980 [5];
  MIR_op_t local_908 [3];
  MIR_op_t local_878 [4];
  MIR_op_t local_7b8 [2];
  MIR_op_t local_758 [10];
  MIR_op_t local_578 [2];
  MIR_op_t local_518 [4];
  MIR_op_t local_458 [2];
  MIR_op_t local_3f8 [17];
  MIR_op_t local_c8 [2];
  MIR_op_t local_68;
  undefined1 auVar28 [32];
  
  ctx = gen_ctx->ctx;
  int_arg_num = 0;
  fp_arg_num = 0;
  if (gen_ctx->curr_func_item->item_type == MIR_func_item) {
    ptVar66 = gen_ctx->target_ctx;
    pMVar81 = (gen_ctx->curr_func_item->u).func;
    local_ea0 = (MIR_insn_t)0x0;
    ptVar66->block_arg_func_p = '\0';
    ptVar66->start_sp_from_bp_offset = 8;
    ptVar66->keep_fp_p = pMVar81->vararg_p;
    local_dc0 = pMVar81;
    for (uVar69 = 0; uVar69 < pMVar81->nargs; uVar69 = uVar69 + 1) {
      VARR_MIR_var_tget(local_980,pMVar81->vars,uVar69);
      MVar73 = local_980[0].type;
      uVar75 = local_980[0].type - MIR_T_RBLK;
      if (uVar75 < 0xfffffffb) {
        uVar72 = 0;
      }
      else {
        VARR_MIR_var_tget(&local_998,pMVar81->vars,uVar69);
        uVar72 = local_998.size + 7 & 0xfffffffffffffff8;
      }
      sVar63 = int_arg_num;
      iVar80 = (int)uVar69;
      if (MVar73 == (MIR_T_BLK|MIR_T_I16)) {
        if (((int)fp_arg_num != -0x11 && fp_arg_num < 8) &&
           (MVar73 = MIR_T_D, uVar72 < 9 || fp_arg_num < 7)) goto LAB_0012f2a6;
LAB_0012f4f0:
        ptVar66 = gen_ctx->target_ctx;
        ptVar66->block_arg_func_p = '\x01';
        ptVar66->keep_fp_p = '\x01';
        _MIR_new_var_op(ctx,iVar80 + 0x22);
        _MIR_new_var_op(ctx,5);
        MIR_new_int_op(ctx,(long)local_ea0 + 8 + (long)gen_ctx->target_ctx->start_sp_from_bp_offset)
        ;
        pMVar62 = MIR_new_insn(ctx,MIR_ADD);
        local_ea0 = (MIR_insn_t)((long)local_ea0 + uVar72);
LAB_0012f5d9:
        prepend_insn(gen_ctx,pMVar62);
      }
      else if (MVar73 == (MIR_T_BLK|MIR_T_U8)) {
        MVar58 = get_int_arg_reg(int_arg_num);
        if (MVar58 == 0xffffffff) goto LAB_0012f4f0;
        MVar73 = MIR_T_I64;
        if (8 < uVar72) {
          MVar58 = get_int_arg_reg(sVar63 + 1);
          MVar73 = MIR_T_I64;
          if (MVar58 == 0xffffffff) goto LAB_0012f4f0;
        }
LAB_0012f2a6:
        MVar58 = get_arg_reg(MVar73,&int_arg_num,&fp_arg_num,&mov_code1);
        MVar60 = mov_code1;
        if (0x10 < uVar72) {
          __assert_fail("blk_size <= 16",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x2ce,"void target_machinize(gen_ctx_t)");
        }
        if (8 < uVar72) {
          MVar59 = get_arg_reg(MVar73,&int_arg_num,&fp_arg_num,&mov_code2);
          _MIR_new_var_mem_op(local_3f8,ctx,MVar73,8,iVar80 + 0x22,0xffffffff,'\x01');
          _MIR_new_var_op(ctx,MVar59);
          pMVar61 = MIR_new_insn(ctx,MVar60);
          prepend_insn(gen_ctx,pMVar61);
        }
        _MIR_new_var_mem_op(local_458,ctx,MVar73,0,iVar80 + 0x22U,0xffffffff,'\x01');
        _MIR_new_var_op(ctx,MVar58);
        pMVar61 = MIR_new_insn(ctx,MVar60);
        prepend_insn(gen_ctx,pMVar61);
        _MIR_new_var_op(ctx,iVar80 + 0x22U);
        MIR_new_int_op(ctx,uVar72);
        pMVar61 = MIR_new_insn(ctx,MIR_ALLOCA);
        prepend_insn(gen_ctx,pMVar61);
        pMVar81 = local_dc0;
      }
      else {
        if (((1 < MVar73 - (MIR_T_BLK|MIR_T_U16)) ||
            (MVar58 = get_int_arg_reg(int_arg_num), MVar58 == 0xffffffff)) ||
           ((int)fp_arg_num == -0x11 || 7 < fp_arg_num)) {
          if (0xfffffffa < uVar75) goto LAB_0012f4f0;
          MVar58 = get_arg_reg(MVar73,&int_arg_num,&fp_arg_num,&new_insn_code);
          if (MVar58 == 0xffffffff) {
            ptVar66 = gen_ctx->target_ctx;
            ptVar66->block_arg_func_p = '\x01';
            ptVar66->keep_fp_p = '\x01';
            MVar77 = MIR_T_I64;
            if ((MVar73 & ~MIR_T_U8) == MIR_T_F) {
              MVar77 = MVar73;
            }
            if (MVar73 == MIR_T_LD) {
              MVar77 = MVar73;
            }
            MVar60 = MIR_FMOV;
            if (MVar73 != MIR_T_F) {
              if (MVar73 == MIR_T_D) {
                MVar60 = MIR_DMOV;
              }
              else {
                MVar60 = (uint)(MVar73 == MIR_T_LD) * 3;
              }
            }
            new_insn_code = MVar60;
            _MIR_new_var_mem_op((MIR_op_t *)&mov_code1,ctx,MVar77,
                                (long)local_ea0 + 8 + (long)ptVar66->start_sp_from_bp_offset,5,
                                0xffffffff,'\x01');
            mem_op.u._16_8_ = aStack_ce8._16_8_;
            mem_op.u.mem.disp = aStack_ce8.mem.disp;
            mem_op.u.i = aStack_ce8.i;
            mem_op.u.str.s = aStack_ce8.str.s;
            _MIR_new_var_op(ctx,iVar80 + 0x22);
            pMVar61 = MIR_new_insn(ctx,MVar60);
            prepend_insn(gen_ctx,pMVar61);
            local_ea0 = (MIR_insn_t)((long)local_ea0 + 8 + (ulong)(MVar73 == MIR_T_LD) * 8);
            goto LAB_0012f731;
          }
          _MIR_new_var_op(ctx,MVar58);
          MVar60 = new_insn_code;
          _MIR_new_var_op(ctx,iVar80 + 0x22);
          pMVar62 = MIR_new_insn(ctx,MVar60);
          goto LAB_0012f5d9;
        }
        MVar77 = (uint)(MVar73 != (MIR_T_BLK|MIR_T_U16)) * 3 + MIR_T_I64;
        MVar73 = (uint)(MVar73 == (MIR_T_BLK|MIR_T_U16)) * 3 + MIR_T_I64;
        MVar58 = get_arg_reg(MVar77,&int_arg_num,&fp_arg_num,&mov_code1);
        MVar59 = get_arg_reg(MVar73,&int_arg_num,&fp_arg_num,&mov_code2);
        MVar60 = mov_code2;
        if (uVar72 != 0x10) {
          __assert_fail("blk_size > 8 && blk_size <= 16",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x2ea,"void target_machinize(gen_ctx_t)");
        }
        base = iVar80 + 0x22;
        _MIR_new_var_mem_op(local_518,ctx,MVar73,8,base,0xffffffff,'\x01');
        _MIR_new_var_op(ctx,MVar59);
        pMVar61 = MIR_new_insn(ctx,MVar60);
        prepend_insn(gen_ctx,pMVar61);
        MVar60 = mov_code1;
        _MIR_new_var_mem_op(local_578,ctx,MVar77,0,base,0xffffffff,'\x01');
        _MIR_new_var_op(ctx,MVar58);
        pMVar61 = MIR_new_insn(ctx,MVar60);
        prepend_insn(gen_ctx,pMVar61);
        _MIR_new_var_op(ctx,base);
        MIR_new_int_op(ctx,0x10);
        pMVar61 = MIR_new_insn(ctx,MIR_ALLOCA);
        prepend_insn(gen_ctx,pMVar61);
        pMVar81 = local_dc0;
      }
LAB_0012f731:
    }
    ptVar66 = gen_ctx->target_ctx;
    ptVar66->alloca_p = '\0';
    ptVar66->leaf_p = '\x01';
    local_bc8 = (undefined1 (*) [32])auStack_c5e;
    pMVar62 = (pMVar81->insns).head;
    do {
      local_df8 = pMVar62;
      pMVar11 = local_df8;
      if (local_df8 == (MIR_insn_t)0x0) {
        return;
      }
      pMVar62 = (local_df8->insn_link).next;
      MVar60 = *(MIR_insn_code_t *)&local_df8->field_0x18;
      switch(MVar60) {
      case MIR_UI2F:
      case MIR_UI2D:
      case MIR_UI2LD:
      case MIR_LD2I:
        pMVar62 = (MIR_insn_t)local_df8->ops[0].data;
        uVar8 = *(undefined2 *)&local_df8->ops[0].field_0x8;
        temp_op_1.u._16_6_ = (undefined6)((ulong)local_df8->ops[0].u.mem.disp >> 0x10);
        temp_op_1.data = *(void **)&local_df8->ops[0].field_0xa;
        temp_op_1._8_8_ = *(undefined8 *)((long)&local_df8->ops[0].u.str.len + 2);
        temp_op_1.u.i = *(int64_t *)((long)&local_df8->ops[0].u.str.s + 2);
        uVar19 = *(undefined8 *)((long)&local_df8->ops[0].u + 0x12);
        temp_op_1.u._8_6_ = (undefined6)uVar19;
        temp_op_1.u.mem.nloc._2_2_ = (undefined2)((ulong)uVar19 >> 0x30);
        pMVar12 = (MIR_insn_t)local_df8[1].data;
        uVar9 = *(ushort *)&local_df8[1].insn_link.prev;
        mem_op_1.u._16_6_ =
             (undefined6)((ulong)*(undefined8 *)&local_df8[1].ops[0].field_0x8 >> 0x10);
        auVar49 = *(undefined1 (*) [30])((long)&local_df8[1].insn_link.prev + 2);
        mem_op_1.u.mem.nloc._2_2_ =
             (undefined2)((ulong)*(undefined8 *)((long)&local_df8[1].ops[0].data + 2) >> 0x30);
        get_builtin(gen_ctx,MVar60,&proto_item_1,&func_import_item_1);
        if (((char)uVar8 != '\x02') || ((uVar9 & 0xff) != 2)) {
          __assert_fail("res_reg_op.mode == MIR_OP_VAR && op_reg_op.mode == MIR_OP_VAR",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x349,"void target_machinize(gen_ctx_t)");
        }
        MVar58 = gen_new_temp_reg(gen_ctx,MIR_T_I64,(gen_ctx->curr_func_item->u).func);
        _MIR_new_var_op(ctx,MVar58);
        pcStack_e40 = (char *)CONCAT71(reg_op3.u._9_7_,reg_op3.u.mem.nonalias._0_1_);
        local_e38 = (MIR_reg_t)CONCAT71(reg_op3.u._17_7_,reg_op3.u.mem.base._0_1_);
        uStack_e34 = (undefined4)((uint7)reg_op3.u._17_7_ >> 0x18);
        local_e30 = reg_op3.u._24_8_;
        mov_code2 = (MIR_insn_code_t)reg_op3.data;
        MVar60 = mov_code2;
        uStack_e54 = (undefined4)((ulong)reg_op3.data >> 0x20);
        uVar50 = uStack_e54;
        cStack_e50 = reg_op3._8_1_;
        cVar6 = cStack_e50;
        uStack_e4f = reg_op3._9_1_;
        uStack_e4e = (undefined6)
                     (CONCAT26(reg_op3._14_2_,CONCAT42(reg_op3._10_4_,reg_op3._8_2_)) >> 0x10);
        bStack_e48 = reg_op3.u.reg._0_1_;
        uStack_e47 = reg_op3.u.i._1_7_;
        MIR_new_ref_op(ctx,func_import_item_1);
        pMVar61 = MIR_new_insn(ctx,MIR_MOV);
        gen_add_insn_before(gen_ctx,local_df8,pMVar61);
        MIR_new_ref_op(ctx,proto_item_1);
        pauVar52 = local_bc8;
        aStack_ce8._16_8_ = CONCAT71(reg_op3.u._17_7_,reg_op3.u.mem.base._0_1_);
        aStack_ce8.i = CONCAT71(reg_op3.u.i._1_7_,reg_op3.u.reg._0_1_);
        aStack_ce8.str.s = (char *)CONCAT71(reg_op3.u._9_7_,reg_op3.u.mem.nonalias._0_1_);
        aStack_ce8.mem.disp = reg_op3.u.mem.disp;
        uStack_cef = (undefined7)
                     (CONCAT26(reg_op3._14_2_,CONCAT42(reg_op3._10_4_,reg_op3._8_2_)) >> 8);
        uStack_ca8 = CONCAT44(uStack_e34,local_e38);
        local_cc8 = CONCAT44(uStack_e54,mov_code2);
        auVar24[8] = cStack_e50;
        auVar24._0_8_ = local_cc8;
        auVar24[9] = uStack_e4f;
        auVar24._10_6_ = uStack_e4e;
        auVar25[0x10] = bStack_e48;
        auVar25._0_16_ = auVar24;
        auVar25._17_7_ = uStack_e47;
        pMStack_ca0 = local_e30;
        uStack_cc0 = auVar24._8_8_;
        uStack_cb8 = auVar25._16_8_;
        pcStack_cb0 = pcStack_e40;
        auVar33._30_2_ = mem_op_1.u.mem.nloc._2_2_;
        auVar33._0_30_ = auVar49;
        uStack_c6e = temp_op_1.u._16_6_;
        uStack_c8e = SUB86(temp_op_1.data,0);
        uStack_c88 = (undefined2)((ulong)temp_op_1.data >> 0x30);
        uStack_c86 = temp_op_1._8_6_;
        uStack_c80 = temp_op_1._14_2_;
        uStack_c7e = (undefined6)temp_op_1.u.i;
        uStack_c78 = (undefined2)((ulong)temp_op_1.u._0_8_ >> 0x30);
        uStack_c76 = temp_op_1.u._8_6_;
        uStack_c70 = temp_op_1.u.mem.nloc._2_2_;
        uStack_c60 = uVar9;
        *(ulong *)(*local_bc8 + 0x1e) = CONCAT62(mem_op_1.u._16_6_,mem_op_1.u.mem.nloc._2_2_);
        *pauVar52 = auVar33;
        mov_code1 = MVar60;
        uStack_cf4 = uVar50;
        cStack_cf0 = cVar6;
        local_c98 = pMVar62;
        uStack_c90 = uVar8;
        local_c68 = pMVar12;
        pMVar64 = MIR_new_insn_arr(ctx,MIR_CALL,4,(MIR_op_t *)&mov_code1);
        gen_add_insn_before(gen_ctx,local_df8,pMVar64);
        local_df8 = pMVar61;
LAB_00132883:
        gen_delete_insn(gen_ctx,pMVar11);
        pMVar62 = local_df8;
        break;
      case MIR_F2I:
      case MIR_D2I:
      case MIR_F2D:
      case MIR_F2LD:
      case MIR_D2F:
      case MIR_D2LD:
      case MIR_LD2F:
      case MIR_LD2D:
      case MIR_NEG:
      case MIR_NEGS:
      case MIR_FNEG:
      case MIR_DNEG:
      case MIR_LDNEG:
      case MIR_ADDR:
      case MIR_ADDR8:
      case MIR_ADDR16:
      case MIR_ADDR32:
      case MIR_ADD:
      case MIR_ADDS:
      case MIR_FADD:
      case MIR_DADD:
      case MIR_LDADD:
      case MIR_SUB:
      case MIR_SUBS:
      case MIR_FSUB:
      case MIR_DSUB:
      case MIR_LDSUB:
      case MIR_MUL:
      case MIR_MULS:
      case MIR_FMUL:
      case MIR_DMUL:
      case MIR_LDMUL:
      case MIR_FDIV:
      case MIR_DDIV:
      case MIR_LDDIV:
      case MIR_AND:
      case MIR_ANDS:
      case MIR_OR:
      case MIR_ORS:
      case MIR_XOR:
      case MIR_XORS:
      case MIR_LDEQ:
      case MIR_LDNE:
      case MIR_LDGT:
      case MIR_LDGE:
      case MIR_ADDO:
      case MIR_ADDOS:
      case MIR_SUBO:
      case MIR_SUBOS:
      case MIR_MULO:
      case MIR_MULOS:
      case MIR_JMP:
      case MIR_BT:
      case MIR_BTS:
      case MIR_BF:
      case MIR_BFS:
      case MIR_BEQ:
      case MIR_BEQS:
      case MIR_FBEQ:
      case MIR_DBEQ:
      case MIR_LDBEQ:
      case MIR_BNE:
      case MIR_BNES:
      case MIR_FBNE:
      case MIR_DBNE:
      case MIR_LDBNE:
      case MIR_BLT:
      case MIR_BLTS:
      case MIR_UBLT:
      case MIR_UBLTS:
      case MIR_BLE:
      case MIR_BLES:
      case MIR_UBLE:
      case MIR_UBLES:
switchD_0012fb4f_caseD_10:
        if (0xfffffffc < MVar60 - MIR_SWITCH) {
          ctx_00 = gen_ctx->ctx;
          pMVar81 = (gen_ctx->curr_func_item->u).func;
          lVar10 = *(long *)((long)&(local_df8->ops[0].u.label)->ops[0].u + 0x10);
          sVar63 = MIR_insn_nops(ctx_00,local_df8);
          uVar75 = *(uint *)(lVar10 + 8);
          local_de0 = (ulong)uVar75;
          int_arg_num_1 = 0;
          fp_arg_num_1 = 0;
          pMVar11 = (local_df8->insn_link).prev;
          if (pMVar11 == (MIR_insn_t)0x0) {
            __assert_fail("prev_call_insn != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0xc0,"void machinize_call(gen_ctx_t, MIR_insn_t)");
          }
          if ((int)*(ulong *)&local_df8->field_0x18 == 0xa8) {
            *(ulong *)&local_df8->field_0x18 =
                 *(ulong *)&local_df8->field_0x18 & 0xffffffff00000000 | 0xa7;
          }
          varr = *(VARR_MIR_var_t **)(lVar10 + 0x20);
          local_de0 = (ulong)(uVar75 + 2);
          local_e60 = pMVar11;
          if (varr == (VARR_MIR_var_t *)0x0) {
            local_bd0 = 0;
            local_d78 = 0;
          }
          else {
            if ((sVar63 < varr->els_num) ||
               ((*(char *)(lVar10 + 0x18) == '\0' && (sVar63 - local_de0 != varr->els_num)))) {
              __assert_fail("nops >= (VARR_MIR_var_tlength (proto->args)) && (proto->vararg_p || nops - start == (VARR_MIR_var_tlength (proto->args)))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                            ,0xc6,"void machinize_call(gen_ctx_t, MIR_insn_t)");
            }
            local_d78 = VARR_MIR_var_tlength(varr);
            if (*(long *)(lVar10 + 0x20) == 0) {
              mir_varr_assert_fail("addr","MIR_var_t");
            }
            local_bd0 = *(long *)(*(long *)(lVar10 + 0x20) + 0x10);
          }
          cVar6 = *(char *)&local_df8[1].insn_link.prev;
          if ((cVar6 != '\x02') && (cVar6 != '\b')) {
            MVar58 = gen_new_temp_reg(gen_ctx,MIR_T_I64,pMVar81);
            _MIR_new_var_op(ctx_00,MVar58);
            temp_op_1.data = (void *)CONCAT44(uStack_cf4,mov_code1);
            temp_op_1._9_7_ = uStack_cef;
            temp_op_1._8_1_ = cStack_cf0;
            temp_op_1.u._16_6_ = (undefined6)aStack_ce8._16_8_;
            temp_op_1.u.mem.index._2_2_ = (undefined2)((ulong)aStack_ce8._16_8_ >> 0x30);
            temp_op_1.u.mem.disp = aStack_ce8.mem.disp;
            temp_op_1.u.i = aStack_ce8.i;
            temp_op_1.u._8_6_ = SUB86(aStack_ce8.str.s,0);
            temp_op_1.u.mem.nloc._2_2_ = (undefined2)((ulong)aStack_ce8._8_8_ >> 0x30);
            pMVar61 = MIR_new_insn(ctx_00,MIR_MOV);
            uVar29 = temp_op_1._8_8_;
            uVar27 = temp_op_1.data;
            auVar28._8_8_ = uVar29;
            auVar28._0_8_ = uVar27;
            uVar30 = temp_op_1.u.i;
            auVar28._16_8_ = uVar30;
            auVar28._24_6_ = temp_op_1.u._8_6_;
            auVar28._30_2_ = temp_op_1.u.mem.nloc._2_2_;
            auVar31._8_6_ = temp_op_1.u._8_6_;
            auVar31._0_8_ = temp_op_1.u.i;
            auVar31._14_2_ = temp_op_1.u.mem.nloc._2_2_;
            auVar31._16_6_ = temp_op_1.u._16_6_;
            auVar31._22_2_ = temp_op_1.u.mem.index._2_2_;
            auVar31._24_8_ = temp_op_1.u.mem.disp;
            local_df8[1].data = temp_op_1.data;
            local_df8[1].insn_link.prev = (MIR_insn_t)SUB168(auVar28._8_16_,0);
            local_df8[1].insn_link.next = (MIR_insn_t)SUB168(auVar28._8_16_,8);
            *(long *)&local_df8[1].field_0x18 = auVar28._24_8_;
            *(undefined1 (*) [32])&local_df8[1].insn_link.next = auVar31;
            gen_add_insn_before(gen_ctx,local_df8,pMVar61);
          }
          local_b80 = local_df8->ops;
          local_e78 = 0;
          local_d60 = 0;
          uVar69 = local_de0;
          while (uVar69 < sVar63) {
            pvVar14 = local_b80[uVar69].data;
            uVar19 = *(undefined8 *)&local_b80[uVar69].field_0x8;
            paVar82 = &local_b80[uVar69].u;
            uVar72 = paVar82->u;
            pcStack_e40 = (char *)(&paVar82->i)[1];
            local_e30 = (&paVar82->ref)[3];
            pMVar79 = local_b80 + uVar69;
            mov_code2 = (MIR_insn_code_t)pvVar14;
            uStack_e54 = (undefined4)((ulong)pvVar14 >> 0x20);
            cStack_e50 = (char)uVar19;
            uStack_e4f = (undefined1)((ulong)uVar19 >> 8);
            uStack_e4e = (undefined6)((ulong)uVar19 >> 0x10);
            bStack_e48 = (byte)uVar72;
            uStack_e47 = (undefined7)(uVar72 >> 8);
            local_e38 = (MIR_reg_t)(&paVar82->i)[2];
            uStack_e34 = (undefined4)((ulong)(&paVar82->i)[2] >> 0x20);
            local_bc0 = uVar69;
            if (cStack_e50 == '\x02') {
              uVar69 = uVar69 - local_de0;
              if (uVar69 < local_d78) goto LAB_00130d94;
LAB_00130da5:
              uVar9 = *(ushort *)&pMVar79->field_0x8 >> 8;
              if (4 < (ushort)(uVar9 - 3)) {
                __assert_fail("mode == MIR_OP_INT || mode == MIR_OP_UINT || mode == MIR_OP_FLOAT || mode == MIR_OP_DOUBLE || mode == MIR_OP_LDOUBLE"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                              ,0xdf,"void machinize_call(gen_ctx_t, MIR_insn_t)");
              }
              pMVar65 = (MIR_item_t_conflict)0x9;
              if (uVar9 != 6) {
                if (uVar9 == 5) {
                  p_Var67 = MIR_get_error_func(ctx_00);
                  pcVar70 = "passing float variadic arg (should be passed as double)";
                  MVar48 = MIR_call_op_error;
                  goto LAB_00132e85;
                }
                pMVar65 = (MIR_item_t_conflict)
                          (ulong)((uint)(*(ushort *)&pMVar79->field_0x8 >> 8 == 7) * 4 + 6);
              }
            }
            else {
              if ((cStack_e50 != '\v') ||
                 (pMVar65 = (MIR_item_t_conflict)(uVar72 & 0xff), bStack_e48 - 0x12 < 0xfffffffa)) {
                __assert_fail("arg_op.mode == MIR_OP_VAR || (arg_op.mode == MIR_OP_VAR_MEM && MIR_all_blk_type_p (arg_op.u.var_mem.type))"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                              ,0xd6,"void machinize_call(gen_ctx_t, MIR_insn_t)");
              }
              uVar69 = uVar69 - local_de0;
              if (uVar69 < local_d78) {
LAB_00130d94:
                pMVar65 = (MIR_item_t_conflict)(ulong)*(uint *)(local_bd0 + uVar69 * 0x18);
              }
              else if (((ushort)uVar19 & 0xff) != 0xb) goto LAB_00130da5;
            }
            MVar73 = (MIR_type_t)pMVar65 & ~MIR_T_U8;
            local_e68 = pMVar65;
            MVar60 = get_ext_code((MIR_type_t)pMVar65);
            if (MVar60 == MIR_INVALID_INSN) {
              pMVar61 = (MIR_insn_t)0x0;
            }
            else {
              MVar58 = gen_new_temp_reg(gen_ctx,MIR_T_I64,pMVar81);
              _MIR_new_var_op(ctx_00,MVar58);
              temp_op_1.data = (void *)CONCAT44(uStack_cf4,mov_code1);
              temp_op_1._9_7_ = uStack_cef;
              temp_op_1._8_1_ = cStack_cf0;
              temp_op_1.u._16_6_ = (undefined6)aStack_ce8._16_8_;
              temp_op_1.u.mem.index._2_2_ = (undefined2)((ulong)aStack_ce8._16_8_ >> 0x30);
              temp_op_1.u.mem.disp = aStack_ce8.mem.disp;
              temp_op_1.u.i = aStack_ce8.i;
              temp_op_1.u._8_6_ = SUB86(aStack_ce8.str.s,0);
              temp_op_1.u.mem.nloc._2_2_ = (undefined2)((ulong)aStack_ce8._8_8_ >> 0x30);
              pMVar61 = MIR_new_insn(ctx_00,MVar60);
              pcStack_e40 = (char *)CONCAT26(temp_op_1.u.mem.nloc._2_2_,temp_op_1.u._8_6_);
              mov_code2 = (MIR_insn_code_t)temp_op_1.data;
              uStack_e54 = (undefined4)((ulong)temp_op_1.data >> 0x20);
              cStack_e50 = temp_op_1._8_1_;
              uStack_e4f = temp_op_1._9_1_;
              uStack_e4e = temp_op_1._10_6_;
              bStack_e48 = (byte)temp_op_1.u.i;
              uStack_e47 = (undefined7)((ulong)temp_op_1.u._0_8_ >> 8);
              local_e38 = (MIR_reg_t)temp_op_1.u._16_6_;
              uStack_e34 = (undefined4)
                           (CONCAT26(temp_op_1.u.mem.index._2_2_,temp_op_1.u._16_6_) >> 0x20);
              local_e30 = temp_op_1.u._24_8_;
              (pMVar79->u).i = temp_op_1.u.i;
              (pMVar79->u).str.s = pcStack_e40;
              *(ulong *)((long)&pMVar79->u + 0x10) =
                   CONCAT26(temp_op_1.u.mem.index._2_2_,temp_op_1.u._16_6_);
              (pMVar79->u).mem.disp = temp_op_1.u.mem.disp;
              pMVar79->data = temp_op_1.data;
              *(undefined8 *)&pMVar79->field_0x8 = temp_op_1._8_8_;
              (pMVar79->u).i = temp_op_1.u.i;
              (pMVar79->u).str.s = (char *)CONCAT26(temp_op_1.u.mem.nloc._2_2_,temp_op_1.u._8_6_);
            }
            sVar51 = int_arg_num_1;
            iVar80 = (int)local_e68;
            if (iVar80 - 0x11U < 0xfffffffb) {
              uVar69 = 0;
            }
            else {
              if (cStack_e50 != '\v') {
                __assert_fail("arg_op.mode == MIR_OP_VAR_MEM",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                              ,0xee,"void machinize_call(gen_ctx_t, MIR_insn_t)");
              }
              uVar69 = (long)((long)&local_e30->data + 7) / 8 << 3;
            }
            lVar1 = local_e78;
            if (iVar80 == 0xe) {
              if (((int)fp_arg_num_1 != -0x11 && fp_arg_num_1 < 8) &&
                 (MVar77 = MIR_T_D, uVar69 < 9 || fp_arg_num_1 < 7)) goto LAB_00130fce;
LAB_00131350:
              if (uVar69 - 1 < 0x10) {
                MVar58 = gen_new_temp_reg(gen_ctx,MIR_T_I64,pMVar81);
                _MIR_new_var_op(ctx_00,MVar58);
                temp_op_1.data = (void *)CONCAT44(uStack_cf4,mov_code1);
                auVar39[8] = cStack_cf0;
                auVar39._0_8_ = temp_op_1.data;
                auVar39._9_7_ = uStack_cef;
                uVar72 = 0;
                bVar83 = false;
                temp_op_1.u._16_6_ = (undefined6)aStack_ce8._16_8_;
                temp_op_1.u.mem.index._2_2_ = (undefined2)((ulong)aStack_ce8._16_8_ >> 0x30);
                temp_op_1.u.mem.disp = aStack_ce8.mem.disp;
                temp_op_1._8_8_ = auVar39._8_8_;
                temp_op_1.u.i = aStack_ce8.i;
                temp_op_1.u._8_6_ = SUB86(aStack_ce8.str.s,0);
                temp_op_1.u.mem.nloc._2_2_ = (undefined2)((ulong)aStack_ce8._8_8_ >> 0x30);
                while( true ) {
                  lVar1 = local_e78 + uVar72;
                  if (uVar69 == uVar72) break;
                  _MIR_new_var_mem_op((MIR_op_t *)&mov_code1,ctx_00,MIR_T_I64,uVar72,local_e38,
                                      0xffffffff,'\x01');
                  pMVar61 = MIR_new_insn(ctx_00,MIR_MOV);
                  gen_add_insn_after(gen_ctx,local_e60,pMVar61);
                  _MIR_new_var_mem_op((MIR_op_t *)&mov_code1,ctx_00,MIR_T_I64,lVar1,4,0xffffffff,
                                      '\x01');
                  pMVar64 = MIR_new_insn(ctx_00,MIR_MOV);
                  gen_add_insn_after(gen_ctx,pMVar61,pMVar64);
                  if (!bVar83) {
                    _MIR_new_var_mem_op((MIR_op_t *)&mov_code1,ctx_00,(MIR_type_t)local_e68,lVar1,4,
                                        0xffffffff,'\x01');
                    auVar40._4_4_ = uStack_cf4;
                    auVar40._0_4_ = mov_code1;
                    auVar40[8] = cStack_cf0;
                    auVar40._9_7_ = uStack_cef;
                    auVar40._16_8_ = aStack_ce8.i;
                    auVar40._24_8_ = aStack_ce8.str.s;
                    aVar43.str.s = aStack_ce8.str.s;
                    aVar43.i = aStack_ce8.i;
                    aVar43._16_8_ = aStack_ce8._16_8_;
                    aVar43.mem.disp = aStack_ce8.mem.disp;
                    pMVar79->u = aVar43;
                    *(undefined1 (*) [32])pMVar79 = auVar40;
                  }
                  uVar72 = uVar72 + 8;
                  bVar83 = true;
                }
              }
              else {
                pMVar65 = _MIR_builtin_proto(ctx_00,gen_ctx->curr_func_item->module,
                                             "mir.arg_memcpy.p",0,(MIR_type_t *)0x0,3,6,"dest",6,
                                             "src",6,"n");
                local_e68 = _MIR_builtin_func(ctx_00,gen_ctx->curr_func_item->module,
                                              "mir.arg_memcpy",memcpy);
                MVar58 = gen_new_temp_reg(gen_ctx,MIR_T_I64,(gen_ctx->curr_func_item->u).func);
                _MIR_new_var_op(ctx_00,MVar58);
                MVar58 = gen_new_temp_reg(gen_ctx,MIR_T_I64,(gen_ctx->curr_func_item->u).func);
                _MIR_new_var_op(ctx_00,MVar58);
                dest_reg_op.u._16_8_ = local_bb8.u._16_8_;
                dest_reg_op.u.mem.disp = local_bb8.u.mem.disp;
                dest_reg_op.data = local_bb8.data;
                dest_reg_op._8_8_ = local_bb8._8_8_;
                dest_reg_op.u.i = local_bb8.u.i;
                dest_reg_op.u.str.s = local_bb8.u.str.s;
                MIR_new_ref_op(ctx_00,pMVar65);
                aStack_ce8._16_8_ = local_bb8.u._16_8_;
                aStack_ce8.mem.disp = local_bb8.u.mem.disp;
                mov_code1 = (MIR_insn_code_t)local_bb8.data;
                uStack_cf4 = (undefined4)((ulong)local_bb8.data >> 0x20);
                cStack_cf0 = local_bb8._8_1_;
                uStack_cef = local_bb8._9_7_;
                aStack_ce8.i = local_bb8.u.i;
                aStack_ce8.str.s = local_bb8.u.str.s;
                local_cc8 = CONCAT44(uStack_ab4,mov_code2_2);
                uStack_ca8 = auStack_a98._0_8_;
                pMStack_ca0 = auStack_a98._8_8_;
                uStack_cc0 = uStack_ab0;
                uStack_cb8 = uStack_aa8;
                pcStack_cb0 = pcStack_aa0;
                _MIR_new_var_op(ctx_00,7);
                uStack_c78 = (undefined2)local_bb8.u._16_8_;
                uStack_c76 = (undefined6)((ulong)local_bb8.u._16_8_ >> 0x10);
                uStack_c70 = (undefined2)local_bb8.u.mem.disp;
                uStack_c6e = (undefined6)((ulong)local_bb8.u._24_8_ >> 0x10);
                local_c98 = (MIR_insn_t)local_bb8.data;
                uStack_c90 = local_bb8._8_2_;
                uStack_c8e = local_bb8._10_6_;
                uStack_c88 = (undefined2)local_bb8.u.i;
                uStack_c86 = (undefined6)((ulong)local_bb8.u._0_8_ >> 0x10);
                uStack_c80 = SUB82(local_bb8.u.str.s,0);
                uStack_c7e = (undefined6)((ulong)local_bb8.u._8_8_ >> 0x10);
                _MIR_new_var_op(ctx_00,6);
                pvStack_c48 = (void *)local_bb8.u._16_8_;
                pMStack_c40 = local_bb8.u._24_8_;
                local_c68 = (MIR_insn_t)local_bb8.data;
                _uStack_c60 = local_bb8._8_8_;
                pMStack_c58 = (MIR_insn_t)local_bb8.u.i;
                pcStack_c50 = local_bb8.u.str.s;
                _MIR_new_var_op(ctx_00,2);
                uStack_c18 = (undefined1)local_bb8.u._16_8_;
                uStack_c17 = (undefined7)((ulong)local_bb8.u._16_8_ >> 8);
                pMStack_c10 = local_bb8.u._24_8_;
                local_c38 = (MIR_insn_t)local_bb8.data;
                _uStack_c30 = local_bb8._8_8_;
                bStack_c28 = (byte)local_bb8.u.i;
                uStack_c27 = (undefined7)((ulong)local_bb8.u._0_8_ >> 8);
                pcStack_c20 = local_bb8.u.str.s;
                pMVar61 = MIR_new_insn_arr(ctx_00,MIR_CALL,5,(MIR_op_t *)&mov_code1);
                pMVar11 = local_e60;
                gen_add_insn_after(gen_ctx,local_e60,pMVar61);
                MIR_new_int_op(ctx_00,uVar69);
                pMVar61 = MIR_new_insn(ctx_00,MIR_MOV);
                gen_add_insn_after(gen_ctx,pMVar11,pMVar61);
                _MIR_new_var_op(ctx_00,local_e38);
                pMVar61 = MIR_new_insn(ctx_00,MIR_MOV);
                gen_add_insn_after(gen_ctx,pMVar11,pMVar61);
                pMVar61 = MIR_new_insn(ctx_00,MIR_MOV);
                gen_add_insn_after(gen_ctx,pMVar11,pMVar61);
                _MIR_new_var_op(ctx_00,4);
                MIR_new_int_op(ctx_00,local_e78);
                pMVar61 = MIR_new_insn(ctx_00,MIR_ADD);
                gen_add_insn_after(gen_ctx,pMVar11,pMVar61);
                MIR_new_ref_op(ctx_00,local_e68);
                pMVar61 = MIR_new_insn(ctx_00,MIR_MOV);
                gen_add_insn_after(gen_ctx,pMVar11,pMVar61);
                _MIR_new_var_mem_op(&local_bb8,ctx_00,MIR_T_BLK,(MIR_disp_t)local_e30,MVar58,
                                    0xffffffff,'\x01');
                auVar44._8_8_ = local_bb8._8_8_;
                auVar44._0_8_ = local_bb8.data;
                auVar44._16_8_ = local_bb8.u.i;
                auVar44._24_8_ = local_bb8.u.str.s;
                aVar45.str.s = local_bb8.u.str.s;
                aVar45.i = local_bb8.u.i;
                aVar45._16_8_ = local_bb8.u._16_8_;
                aVar45.mem.disp = local_bb8.u.mem.disp;
                pMVar79->u = aVar45;
                *(undefined1 (*) [32])pMVar79 = auVar44;
                lVar1 = uVar69 + local_e78;
              }
            }
            else if (iVar80 == 0xd) {
              MVar58 = get_int_arg_reg(int_arg_num_1);
              if (MVar58 == 0xffffffff) goto LAB_00131350;
              MVar77 = MIR_T_I64;
              if (8 < uVar69) {
                MVar58 = get_int_arg_reg(sVar51 + 1);
                MVar77 = MIR_T_I64;
                if (MVar58 == 0xffffffff) goto LAB_00131350;
              }
LAB_00130fce:
              MVar58 = get_arg_reg(MVar77,&int_arg_num_1,&fp_arg_num_1,&mov_code1);
              MVar60 = mov_code1;
              if (0x10 < uVar69) {
                __assert_fail("size <= 16",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                              ,0xfc,"void machinize_call(gen_ctx_t, MIR_insn_t)");
              }
              _MIR_new_var_op(ctx_00,MVar58);
              _MIR_new_var_mem_op((MIR_op_t *)&func_import_item_1,ctx_00,MVar77,0,local_e38,
                                  0xffffffff,'\x01');
              pMVar61 = MIR_new_insn(ctx_00,MVar60);
              gen_add_insn_before(gen_ctx,local_df8,pMVar61);
              setup_call_hard_reg_args(gen_ctx,local_df8,MVar58);
              *(undefined4 *)((long)&pMVar79->u + 0x10) = 0xffffffff;
              if (8 < uVar69) {
                MVar58 = get_arg_reg(MVar77,&int_arg_num_1,&fp_arg_num_1,&mov_code1);
                MVar60 = mov_code1;
                _MIR_new_var_op(ctx_00,MVar58);
                _MIR_new_var_mem_op((MIR_op_t *)&func_import_item,ctx_00,MVar77,8,local_e38,
                                    0xffffffff,'\x01');
                pMVar61 = MIR_new_insn(ctx_00,MVar60);
                gen_add_insn_before(gen_ctx,local_df8,pMVar61);
                setup_call_hard_reg_args(gen_ctx,local_df8,MVar58);
              }
            }
            else if (((iVar80 - 0xfU < 2) &&
                     (MVar58 = get_int_arg_reg(int_arg_num_1), MVar58 != 0xffffffff)) &&
                    ((int)fp_arg_num_1 != -0x11 && fp_arg_num_1 < 8)) {
              bVar83 = (int)local_e68 == 0xf;
              MVar77 = (uint)!bVar83 * 3 + MIR_T_I64;
              MVar74 = (uint)bVar83 * 3 + MIR_T_I64;
              MVar58 = get_arg_reg(MVar77,&int_arg_num_1,&fp_arg_num_1,&mov_code1);
              local_e68 = (MIR_item_t_conflict)CONCAT44(local_e68._4_4_,MVar74);
              MVar59 = get_arg_reg(MVar74,&int_arg_num_1,&fp_arg_num_1,&mov_code2_2);
              MVar60 = mov_code1;
              if (uVar69 != 0x10) {
                __assert_fail("size > 8 && size <= 16",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                              ,0x116,"void machinize_call(gen_ctx_t, MIR_insn_t)");
              }
              _MIR_new_var_op(ctx_00,MVar58);
              _MIR_new_var_mem_op(&local_68,ctx_00,MVar77,0,local_e38,0xffffffff,'\x01');
              pMVar61 = MIR_new_insn(ctx_00,MVar60);
              setup_call_hard_reg_args(gen_ctx,local_df8,MVar58);
              *(undefined4 *)((long)&pMVar79->u + 0x10) = 0xffffffff;
              gen_add_insn_before(gen_ctx,local_df8,pMVar61);
              MVar60 = mov_code2_2;
              _MIR_new_var_op(ctx_00,MVar59);
              _MIR_new_var_mem_op(local_c8,ctx_00,(MIR_type_t)local_e68,8,local_e38,0xffffffff,
                                  '\x01');
              pMVar61 = MIR_new_insn(ctx_00,MVar60);
              gen_add_insn_before(gen_ctx,local_df8,pMVar61);
              setup_call_hard_reg_args(gen_ctx,local_df8,MVar59);
            }
            else {
              MVar77 = (MIR_type_t)local_e68;
              if (0xfffffffa < iVar80 - 0x11U) goto LAB_00131350;
              MVar58 = get_arg_reg(MVar77,&int_arg_num_1,&fp_arg_num_1,&new_insn_code_1);
              if (MVar58 == 0xffffffff) {
                if (MVar77 == MIR_T_RBLK) {
                  if (cStack_e50 != '\v') {
                    __assert_fail("arg_op.mode == MIR_OP_VAR_MEM",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                  ,0x1b1,"void machinize_call(gen_ctx_t, MIR_insn_t)");
                  }
                  _MIR_new_var_op(ctx_00,local_e38);
                  local_e38 = (MIR_reg_t)aStack_ce8._16_8_;
                  uStack_e34 = (undefined4)((ulong)aStack_ce8._16_8_ >> 0x20);
                  local_e30 = aStack_ce8._24_8_;
                  mov_code2 = mov_code1;
                  uStack_e54 = uStack_cf4;
                  cStack_e50 = cStack_cf0;
                  uStack_e4f = (undefined1)uStack_cef;
                  uStack_e4e = SUB76(uStack_cef,1);
                  bStack_e48 = (byte)aStack_ce8.i;
                  uStack_e47 = (undefined7)((ulong)aStack_ce8._0_8_ >> 8);
                  pcStack_e40 = aStack_ce8.str.s;
                  MVar74 = MIR_T_I64;
                  if (MVar73 == MIR_T_F) {
                    MVar74 = MIR_T_RBLK;
                  }
                  local_e98 = 0;
                  MVar60 = MIR_MOV;
                }
                else {
                  MVar74 = MIR_T_I64;
                  if (MVar73 == MIR_T_F) {
                    MVar74 = MVar77;
                  }
                  uVar75 = CONCAT31(0xffffff,MVar77 == MIR_T_LD);
                  if (MVar77 == MIR_T_LD) {
                    MVar74 = MVar77;
                  }
                  if (MVar77 == MIR_T_F) {
                    MVar60 = MIR_FMOV;
                    local_e98 = (ulong)uVar75;
                  }
                  else if (MVar77 == MIR_T_D) {
                    local_e98 = 0;
                    MVar60 = MIR_DMOV;
                  }
                  else {
                    local_e98 = (ulong)uVar75;
                    MVar60 = (uint)(MVar77 == MIR_T_LD) * 3;
                  }
                }
                new_insn_code_1 = MVar60;
                _MIR_new_var_mem_op((MIR_op_t *)&mov_code1,ctx_00,MVar74,local_e78,4,0xffffffff,
                                    '\x01');
                uVar20 = aStack_ce8.mem.disp;
                uVar19 = aStack_ce8.i;
                auVar32._4_4_ = uStack_cf4;
                auVar32._0_4_ = mov_code1;
                auVar32._9_7_ = uStack_cef;
                auVar32[8] = cStack_cf0;
                mem_op_1.u._16_6_ = (undefined6)aStack_ce8._16_8_;
                mem_op_1.u.mem.index._2_2_ = (undefined2)((ulong)aStack_ce8._16_8_ >> 0x30);
                mem_op_1.u._8_6_ = SUB86(aStack_ce8.str.s,0);
                mem_op_1.u.mem.nloc._2_2_ = (undefined2)((ulong)aStack_ce8._8_8_ >> 0x30);
                pMVar64 = MIR_new_insn(ctx_00,MVar60);
                MIR_insert_insn_after(ctx_00,gen_ctx->curr_func_item,local_e60,pMVar64);
                create_new_bb_insns(gen_ctx,(pMVar64->insn_link).prev,(pMVar64->insn_link).next,
                                    local_df8);
                auVar32._16_8_ = uVar19;
                auVar32._24_6_ = mem_op_1.u._8_6_;
                auVar32._30_2_ = mem_op_1.u.mem.nloc._2_2_;
                aVar34._8_6_ = mem_op_1.u._8_6_;
                aVar34.u = uVar19;
                aVar34.mem.nloc._2_2_ = mem_op_1.u.mem.nloc._2_2_;
                aVar34._16_6_ = mem_op_1.u._16_6_;
                aVar34.mem.index._2_2_ = mem_op_1.u.mem.index._2_2_;
                aVar34.mem.disp = uVar20;
                pMVar79->u = aVar34;
                *(undefined1 (*) [32])pMVar79 = auVar32;
                lVar1 = local_e78 + 8 + (local_e98 & 0xff) * 8;
                if (pMVar61 != (MIR_insn_t)0x0) {
                  gen_add_insn_after(gen_ctx,local_e60,pMVar61);
                }
              }
              else {
                if (pMVar61 != (MIR_insn_t)0x0) {
                  gen_add_insn_before(gen_ctx,local_df8,pMVar61);
                }
                MVar60 = new_insn_code_1;
                if ((MIR_type_t)local_e68 == 0x11) {
                  if (cStack_e50 != '\v') {
                    __assert_fail("arg_op.mode == MIR_OP_VAR_MEM",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                  ,0x198,"void machinize_call(gen_ctx_t, MIR_insn_t)");
                  }
                  _MIR_new_var_op(ctx_00,MVar58);
                  _MIR_new_var_op(ctx_00,local_e38);
                  pMVar61 = MIR_new_insn(ctx_00,MVar60);
                  _MIR_new_var_mem_op((MIR_op_t *)&mov_code1,ctx_00,MIR_T_RBLK,(MIR_disp_t)local_e30
                                      ,MVar58,0xffffffff,'\x01');
                  reg_op3.data = (void *)CONCAT44(uStack_cf4,mov_code1);
                  reg_op3.u.mem.base._0_1_ = (undefined1)aStack_ce8._16_8_;
                  reg_op3.u._17_7_ = (undefined7)((ulong)aStack_ce8._16_8_ >> 8);
                  reg_op3.u.mem.disp = aStack_ce8.mem.disp;
                  reg_op3._8_2_ = SUB82(CONCAT71(uStack_cef,cStack_cf0),0);
                  reg_op3._10_4_ = SUB74(uStack_cef,1);
                  reg_op3._14_2_ = SUB72(uStack_cef,5);
                  reg_op3.u.reg._0_1_ = (undefined1)aStack_ce8.i;
                  reg_op3.u.i._1_7_ = (undefined7)((ulong)aStack_ce8._0_8_ >> 8);
                  reg_op3.u.mem.nonalias._0_1_ = SUB81(aStack_ce8.str.s,0);
                  reg_op3.u._9_7_ = (undefined7)((ulong)aStack_ce8._8_8_ >> 8);
                }
                else {
                  _MIR_new_var_op(ctx_00,MVar58);
                  reg_op3.data = (void *)CONCAT44(uStack_cf4,mov_code1);
                  reg_op3.u.mem.base._0_1_ = (undefined1)aStack_ce8._16_8_;
                  reg_op3.u._17_7_ = (undefined7)((ulong)aStack_ce8._16_8_ >> 8);
                  reg_op3.u.mem.disp = aStack_ce8.mem.disp;
                  reg_op3._8_2_ = SUB82(CONCAT71(uStack_cef,cStack_cf0),0);
                  reg_op3._10_4_ = SUB74(uStack_cef,1);
                  reg_op3._14_2_ = SUB72(uStack_cef,5);
                  reg_op3.u.reg._0_1_ = (undefined1)aStack_ce8.i;
                  reg_op3.u.i._1_7_ = (undefined7)((ulong)aStack_ce8._0_8_ >> 8);
                  reg_op3.u.mem.nonalias._0_1_ = SUB81(aStack_ce8.str.s,0);
                  reg_op3.u._9_7_ = (undefined7)((ulong)aStack_ce8._8_8_ >> 8);
                  pMVar61 = MIR_new_insn(ctx_00,new_insn_code_1);
                }
                gen_add_insn_before(gen_ctx,local_df8,pMVar61);
                auVar35._8_2_ = reg_op3._8_2_;
                auVar35._0_8_ = reg_op3.data;
                auVar35._10_4_ = reg_op3._10_4_;
                auVar35._14_2_ = reg_op3._14_2_;
                auVar35[0x10] = reg_op3.u.reg._0_1_;
                auVar35._17_7_ = reg_op3.u.i._1_7_;
                auVar35[0x18] = reg_op3.u.mem.nonalias._0_1_;
                auVar35._25_7_ = reg_op3.u._9_7_;
                aVar36.i._1_7_ = reg_op3.u.i._1_7_;
                aVar36.reg._0_1_ = reg_op3.u.reg._0_1_;
                aVar36.mem.nonalias._0_1_ = reg_op3.u.mem.nonalias._0_1_;
                aVar36._9_7_ = reg_op3.u._9_7_;
                aVar36.mem.base._0_1_ = reg_op3.u.mem.base._0_1_;
                aVar36._17_7_ = reg_op3.u._17_7_;
                aVar36.mem.disp = reg_op3.u.mem.disp;
                pMVar79->u = aVar36;
                *(undefined1 (*) [32])pMVar79 = auVar35;
              }
            }
            local_e78 = lVar1;
            local_d60 = local_d60 + (local_d60 < 8 && MVar73 == MIR_T_F);
            uVar69 = local_bc0 + 1;
          }
          if (*(char *)(lVar10 + 0x18) != '\0') {
            setup_call_hard_reg_args(gen_ctx,local_df8,0);
            _MIR_new_var_op(ctx_00,0);
            MIR_new_int_op(ctx_00,local_d60);
            pMVar61 = MIR_new_insn(ctx_00,MIR_MOV);
            gen_add_insn_before(gen_ctx,local_df8,pMVar61);
          }
          paVar82 = &local_df8[1].ops[0].u;
          uVar68 = 0;
          uVar75 = 0;
          uVar76 = 0;
          for (uVar69 = 0; uVar69 < *(uint *)(lVar10 + 8); uVar69 = uVar69 + 1) {
            uVar19._0_4_ = *(MIR_alias_t *)((long)paVar82 + 8);
            uVar19._4_4_ = *(uint32_t *)((long)paVar82 + 0xc);
            aStack_ce8.i = *(undefined8 *)((long)paVar82 + 0x10);
            aStack_ce8.str.s = (char *)(paVar82->mem).disp;
            aStack_ce8._16_8_ = paVar82[1].i;
            aStack_ce8.mem.disp = *(long *)((long)paVar82 + 0x28);
            mov_code1 = (MIR_insn_code_t)paVar82->u;
            uStack_cf4 = (undefined4)(paVar82->u >> 0x20);
            cStack_cf0 = (char)(undefined4)uVar19;
            uStack_cef = (undefined7)((ulong)uVar19 >> 8);
            if (cStack_cf0 != '\x02') {
              __assert_fail("ret_reg_op.mode == MIR_OP_VAR",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                            ,0x1d8,"void machinize_call(gen_ctx_t, MIR_insn_t)");
            }
            iVar80 = *(int *)(*(long *)(lVar10 + 0x10) + uVar69 * 4);
            if (uVar75 < 2 && iVar80 == 8) {
              _MIR_new_var_op(ctx_00,0x11 - (uVar75 == 0));
              MVar60 = MIR_FMOV;
LAB_001321d4:
              pMVar61 = MIR_new_insn(ctx_00,MVar60);
              uVar75 = uVar75 + 1;
            }
            else {
              if (iVar80 == 9 && uVar75 < 2) {
                _MIR_new_var_op(ctx_00,0x11 - (uVar75 == 0));
                MVar60 = MIR_DMOV;
                goto LAB_001321d4;
              }
              if (uVar68 < 2 && iVar80 == 10) {
                _MIR_new_var_op(ctx_00,0x21 - (uVar68 == 0));
                pMVar61 = MIR_new_insn(ctx_00,MIR_LDMOV);
                uVar68 = uVar68 + 1;
              }
              else {
                if (1 < uVar76) goto LAB_00132d95;
                _MIR_new_var_op(ctx_00,(uint)(uVar76 != 0) * 2);
                pMVar61 = MIR_new_insn(ctx_00,MIR_MOV);
                uVar76 = uVar76 + 1;
              }
            }
            MIR_insert_insn_after(ctx_00,gen_ctx->curr_func_item,local_df8,pMVar61);
            aVar4 = *(anon_union_32_12_57d33f68_for_u *)(pMVar61 + 1);
            *(undefined1 (*) [32])((long)paVar82 + 0x10) =
                 *(undefined1 (*) [32])&pMVar61[1].insn_link.next;
            *paVar82 = aVar4;
            MVar60 = get_ext_code(*(MIR_type_t *)(*(long *)(lVar10 + 0x10) + uVar69 * 4));
            if (MVar60 != MIR_INVALID_INSN) {
              pMVar65 = gen_ctx->curr_func_item;
              pMVar64 = MIR_new_insn(ctx_00,MVar60);
              MIR_insert_insn_after(ctx_00,pMVar65,pMVar61,pMVar64);
              pMVar61 = (pMVar61->insn_link).next;
            }
            create_new_bb_insns(gen_ctx,local_df8,(pMVar61->insn_link).next,local_df8);
            paVar82 = (anon_union_32_12_57d33f68_for_u *)((long)paVar82 + 0x30);
          }
          if (local_e78 == 0) {
            ptVar66 = gen_ctx->target_ctx;
          }
          else {
            _MIR_new_var_op(ctx_00,4);
            _MIR_new_var_op(ctx_00,4);
            uVar69 = local_e78 + 0xfU & 0xfffffffffffffff0;
            MIR_new_int_op(ctx_00,uVar69);
            pMVar61 = MIR_new_insn(ctx_00,MIR_SUB);
            pMVar11 = local_e60;
            MIR_insert_insn_after(ctx_00,gen_ctx->curr_func_item,local_e60,pMVar61);
            create_new_bb_insns(gen_ctx,pMVar11,(pMVar61->insn_link).next,local_df8);
            _MIR_new_var_op(ctx_00,4);
            _MIR_new_var_op(ctx_00,4);
            MIR_new_int_op(ctx_00,uVar69);
            pMVar61 = MIR_new_insn(ctx_00,MIR_ADD);
            MIR_insert_insn_after(ctx_00,gen_ctx->curr_func_item,local_df8,pMVar61);
            create_new_bb_insns(gen_ctx,local_df8,(pMVar61->insn_link).next,local_df8);
            ptVar66 = gen_ctx->target_ctx;
            if ((local_e78 + 0xfU & 0xfffffffffffffff0) != 0) {
              ptVar66->keep_fp_p = '\x01';
            }
          }
          ptVar66->leaf_p = '\0';
        }
        break;
      case MIR_DIV:
      case MIR_DIVS:
      case MIR_UDIV:
      case MIR_UDIVS:
      case MIR_UMULO:
      case MIR_UMULOS:
        _MIR_new_var_op(ctx,0);
        pMVar61 = MIR_new_insn(ctx,MIR_MOV);
        gen_add_insn_before(gen_ctx,local_df8,pMVar61);
        pMVar61 = MIR_new_insn(ctx,MIR_MOV);
        gen_add_insn_after(gen_ctx,local_df8,pMVar61);
        auVar41._8_8_ = aStack_ce8.str.s;
        auVar41._0_8_ = aStack_ce8.i;
        auVar41._16_8_ = aStack_ce8._16_8_;
        auVar41._24_8_ = aStack_ce8.mem.disp;
        *(undefined1 (*) [32])&local_df8[1].insn_link.next = auVar41;
        local_df8[1].data = (void *)CONCAT44(uStack_cf4,mov_code1);
        local_df8[1].insn_link.prev = (MIR_insn_t)CONCAT71(uStack_cef,cStack_cf0);
        local_df8[1].insn_link.next = (MIR_insn_t)aStack_ce8.i;
        *(char **)&local_df8[1].field_0x18 = aStack_ce8.str.s;
        auVar37._4_4_ = uStack_cf4;
        auVar37._0_4_ = mov_code1;
        auVar37[8] = cStack_cf0;
        auVar37._9_7_ = uStack_cef;
        auVar37._16_8_ = aStack_ce8.i;
        auVar37._24_8_ = aStack_ce8.str.s;
        *(undefined8 *)((long)&local_df8->ops[0].u + 0x10) = aStack_ce8._16_8_;
        local_df8->ops[0].u.mem.disp = aStack_ce8.mem.disp;
        *(undefined1 (*) [32])local_df8->ops = auVar37;
        break;
      case MIR_MOD:
      case MIR_MODS:
      case MIR_UMOD:
      case MIR_UMODS:
        _MIR_new_var_op(ctx,0);
        _MIR_new_var_op(ctx,2);
        pMVar61 = MIR_new_insn(ctx,MIR_MOV);
        gen_add_insn_before(gen_ctx,local_df8,pMVar61);
        local_df8[1].insn_link.next = (MIR_insn_t)aStack_ce8.i;
        *(char **)&local_df8[1].field_0x18 = aStack_ce8.str.s;
        local_df8[1].ops[0].data = (void *)aStack_ce8._16_8_;
        *(MIR_disp_t *)&local_df8[1].ops[0].field_0x8 = aStack_ce8.mem.disp;
        local_df8[1].data = (void *)CONCAT44(uStack_cf4,mov_code1);
        local_df8[1].insn_link.prev = (MIR_insn_t)CONCAT71(uStack_cef,cStack_cf0);
        local_df8[1].insn_link.next = (MIR_insn_t)aStack_ce8.i;
        *(char **)&local_df8[1].field_0x18 = aStack_ce8.str.s;
        pMVar61 = MIR_new_insn(ctx,MIR_MOV);
        gen_add_insn_after(gen_ctx,local_df8,pMVar61);
        auVar23._4_4_ = uStack_e54;
        auVar23._0_4_ = mov_code2;
        auVar23[8] = cStack_e50;
        auVar23[9] = uStack_e4f;
        auVar23._10_6_ = uStack_e4e;
        auVar23[0x10] = bStack_e48;
        auVar23._17_7_ = uStack_e47;
        auVar23._24_8_ = pcStack_e40;
        aVar26.i._1_7_ = uStack_e47;
        aVar26.reg._0_1_ = bStack_e48;
        aVar26.str.s = pcStack_e40;
        aVar26.mem.base = local_e38;
        aVar26.mem.index = uStack_e34;
        aVar26._24_8_ = local_e30;
        local_df8->ops[0].u = aVar26;
        *(undefined1 (*) [32])local_df8->ops = auVar23;
        break;
      case MIR_LSH:
      case MIR_LSHS:
      case MIR_RSH:
      case MIR_RSHS:
      case MIR_URSH:
      case MIR_URSHS:
        _MIR_new_var_op(ctx,1);
        pMVar61 = MIR_new_insn(ctx,MIR_MOV);
        gen_add_insn_before(gen_ctx,local_df8,pMVar61);
        aVar38.mem.alias = uStack_cf4;
        aVar38.reg = mov_code1;
        aVar38.mem.nonalias._0_1_ = cStack_cf0;
        aVar38._9_7_ = uStack_cef;
        aVar38._16_8_ = aStack_ce8.i;
        aVar38._24_8_ = aStack_ce8._8_8_;
        auVar42._8_8_ = aStack_ce8.str.s;
        auVar42._0_8_ = aStack_ce8.i;
        auVar42._16_8_ = aStack_ce8._16_8_;
        auVar42._24_8_ = aStack_ce8.mem.disp;
        *(undefined1 (*) [32])((long)&local_df8[1].ops[0].u + 0x10) = auVar42;
        local_df8[1].ops[0].u = aVar38;
        break;
      case MIR_EQ:
      case MIR_EQS:
      case MIR_FEQ:
      case MIR_DEQ:
      case MIR_NE:
      case MIR_NES:
      case MIR_FNE:
      case MIR_DNE:
      case MIR_LT:
      case MIR_LTS:
      case MIR_ULT:
      case MIR_ULTS:
      case MIR_FLT:
      case MIR_DLT:
      case MIR_LE:
      case MIR_LES:
      case MIR_ULE:
      case MIR_ULES:
      case MIR_FLE:
      case MIR_DLE:
      case MIR_GT:
      case MIR_GTS:
      case MIR_UGT:
      case MIR_UGTS:
      case MIR_FGT:
      case MIR_DGT:
      case MIR_GE:
      case MIR_GES:
      case MIR_UGE:
      case MIR_UGES:
      case MIR_FGE:
      case MIR_DGE:
        pMVar61 = MIR_new_insn(ctx,MIR_UEXT8);
        gen_add_insn_after(gen_ctx,local_df8,pMVar61);
        switch(MVar60) {
        case MIR_FLT:
          temp_op.data = ((anon_union_32_12_57d33f68_for_u *)(local_df8 + 1))->ref;
          temp_op._8_8_ = local_df8[1].insn_link.prev;
          ppMVar13 = &local_df8[1].insn_link.next;
          temp_op.u.i = (int64_t)*ppMVar13;
          temp_op.u.str.s = (char *)*(undefined8 *)&local_df8[1].field_0x18;
          aVar4 = *(anon_union_32_12_57d33f68_for_u *)(local_df8 + 1);
          temp_op.u._16_8_ = local_df8[1].ops[0].data;
          temp_op.u.mem.disp = *(undefined8 *)&local_df8[1].ops[0].field_0x8;
          auVar3 = *(undefined1 (*) [32])ppMVar13;
          pvVar14 = (void *)local_df8[1].ops[0].u.i;
          pMVar11 = (MIR_insn_t)local_df8[1].ops[0].u.str.s;
          pMVar12 = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
          MVar15 = local_df8[1].ops[0].u.mem.disp;
          MVar16 = local_df8[1].ops[0].u.mem.disp;
          pvVar17 = local_df8[2].data;
          pMVar18 = local_df8[2].insn_link.prev;
          local_df8[1].insn_link.next = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
          *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar16;
          local_df8[1].ops[0].data = pvVar17;
          *(MIR_insn_t *)&local_df8[1].ops[0].field_0x8 = pMVar18;
          local_df8[1].data = pvVar14;
          local_df8[1].insn_link.prev = pMVar11;
          local_df8[1].insn_link.next = pMVar12;
          *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar15;
          local_df8[1].ops[0].u = aVar4;
          *(undefined1 (*) [32])((long)&local_df8[1].ops[0].u + 0x10) = auVar3;
          *(ulong *)&local_df8->field_0x18 =
               *(ulong *)&local_df8->field_0x18 & 0xffffffff00000000 | 100;
          break;
        case MIR_DLT:
          temp_op.data = ((anon_union_32_12_57d33f68_for_u *)(local_df8 + 1))->ref;
          temp_op._8_8_ = local_df8[1].insn_link.prev;
          ppMVar13 = &local_df8[1].insn_link.next;
          temp_op.u.i = (int64_t)*ppMVar13;
          temp_op.u.str.s = (char *)*(undefined8 *)&local_df8[1].field_0x18;
          aVar4 = *(anon_union_32_12_57d33f68_for_u *)(local_df8 + 1);
          temp_op.u._16_8_ = local_df8[1].ops[0].data;
          temp_op.u.mem.disp = *(undefined8 *)&local_df8[1].ops[0].field_0x8;
          auVar3 = *(undefined1 (*) [32])ppMVar13;
          pvVar14 = (void *)local_df8[1].ops[0].u.i;
          pMVar11 = (MIR_insn_t)local_df8[1].ops[0].u.str.s;
          pMVar12 = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
          MVar15 = local_df8[1].ops[0].u.mem.disp;
          MVar16 = local_df8[1].ops[0].u.mem.disp;
          pvVar17 = local_df8[2].data;
          pMVar18 = local_df8[2].insn_link.prev;
          local_df8[1].insn_link.next = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
          *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar16;
          local_df8[1].ops[0].data = pvVar17;
          *(MIR_insn_t *)&local_df8[1].ops[0].field_0x8 = pMVar18;
          local_df8[1].data = pvVar14;
          local_df8[1].insn_link.prev = pMVar11;
          local_df8[1].insn_link.next = pMVar12;
          *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar15;
          local_df8[1].ops[0].u = aVar4;
          *(undefined1 (*) [32])((long)&local_df8[1].ops[0].u + 0x10) = auVar3;
          *(ulong *)&local_df8->field_0x18 =
               *(ulong *)&local_df8->field_0x18 & 0xffffffff00000000 | 0x65;
          break;
        case MIR_FLE:
          temp_op.data = ((anon_union_32_12_57d33f68_for_u *)(local_df8 + 1))->ref;
          temp_op._8_8_ = local_df8[1].insn_link.prev;
          ppMVar13 = &local_df8[1].insn_link.next;
          temp_op.u.i = (int64_t)*ppMVar13;
          temp_op.u.str.s = (char *)*(undefined8 *)&local_df8[1].field_0x18;
          aVar4 = *(anon_union_32_12_57d33f68_for_u *)(local_df8 + 1);
          temp_op.u._16_8_ = local_df8[1].ops[0].data;
          temp_op.u.mem.disp = *(undefined8 *)&local_df8[1].ops[0].field_0x8;
          auVar3 = *(undefined1 (*) [32])ppMVar13;
          pvVar14 = (void *)local_df8[1].ops[0].u.i;
          pMVar11 = (MIR_insn_t)local_df8[1].ops[0].u.str.s;
          pMVar12 = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
          MVar15 = local_df8[1].ops[0].u.mem.disp;
          MVar16 = local_df8[1].ops[0].u.mem.disp;
          pvVar17 = local_df8[2].data;
          pMVar18 = local_df8[2].insn_link.prev;
          local_df8[1].insn_link.next = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
          *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar16;
          local_df8[1].ops[0].data = pvVar17;
          *(MIR_insn_t *)&local_df8[1].ops[0].field_0x8 = pMVar18;
          local_df8[1].data = pvVar14;
          local_df8[1].insn_link.prev = pMVar11;
          local_df8[1].insn_link.next = pMVar12;
          *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar15;
          local_df8[1].ops[0].u = aVar4;
          *(undefined1 (*) [32])((long)&local_df8[1].ops[0].u + 0x10) = auVar3;
          *(ulong *)&local_df8->field_0x18 =
               *(ulong *)&local_df8->field_0x18 & 0xffffffff00000000 | 0x6b;
          break;
        case MIR_DLE:
          temp_op.data = ((anon_union_32_12_57d33f68_for_u *)(local_df8 + 1))->ref;
          temp_op._8_8_ = local_df8[1].insn_link.prev;
          ppMVar13 = &local_df8[1].insn_link.next;
          temp_op.u.i = (int64_t)*ppMVar13;
          temp_op.u.str.s = (char *)*(undefined8 *)&local_df8[1].field_0x18;
          aVar4 = *(anon_union_32_12_57d33f68_for_u *)(local_df8 + 1);
          temp_op.u._16_8_ = local_df8[1].ops[0].data;
          temp_op.u.mem.disp = *(undefined8 *)&local_df8[1].ops[0].field_0x8;
          auVar3 = *(undefined1 (*) [32])ppMVar13;
          pvVar14 = (void *)local_df8[1].ops[0].u.i;
          pMVar11 = (MIR_insn_t)local_df8[1].ops[0].u.str.s;
          pMVar12 = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
          MVar15 = local_df8[1].ops[0].u.mem.disp;
          MVar16 = local_df8[1].ops[0].u.mem.disp;
          pvVar17 = local_df8[2].data;
          pMVar18 = local_df8[2].insn_link.prev;
          local_df8[1].insn_link.next = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
          *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar16;
          local_df8[1].ops[0].data = pvVar17;
          *(MIR_insn_t *)&local_df8[1].ops[0].field_0x8 = pMVar18;
          local_df8[1].data = pvVar14;
          local_df8[1].insn_link.prev = pMVar11;
          local_df8[1].insn_link.next = pMVar12;
          *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar15;
          local_df8[1].ops[0].u = aVar4;
          *(undefined1 (*) [32])((long)&local_df8[1].ops[0].u + 0x10) = auVar3;
          *(ulong *)&local_df8->field_0x18 =
               *(ulong *)&local_df8->field_0x18 & 0xffffffff00000000 | 0x6c;
        }
        break;
      case MIR_LDLT:
        temp_op.data = ((anon_union_32_12_57d33f68_for_u *)(local_df8 + 1))->ref;
        temp_op._8_8_ = local_df8[1].insn_link.prev;
        ppMVar13 = &local_df8[1].insn_link.next;
        temp_op.u.i = (int64_t)*ppMVar13;
        temp_op.u.str.s = (char *)*(undefined8 *)&local_df8[1].field_0x18;
        aVar4 = *(anon_union_32_12_57d33f68_for_u *)(local_df8 + 1);
        temp_op.u._16_8_ = local_df8[1].ops[0].data;
        temp_op.u.mem.disp = *(undefined8 *)&local_df8[1].ops[0].field_0x8;
        auVar3 = *(undefined1 (*) [32])ppMVar13;
        pvVar14 = (void *)local_df8[1].ops[0].u.i;
        pMVar11 = (MIR_insn_t)local_df8[1].ops[0].u.str.s;
        pMVar12 = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
        MVar15 = local_df8[1].ops[0].u.mem.disp;
        MVar16 = local_df8[1].ops[0].u.mem.disp;
        pvVar17 = local_df8[2].data;
        pMVar18 = local_df8[2].insn_link.prev;
        local_df8[1].insn_link.next = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
        *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar16;
        local_df8[1].ops[0].data = pvVar17;
        *(MIR_insn_t *)&local_df8[1].ops[0].field_0x8 = pMVar18;
        local_df8[1].data = pvVar14;
        local_df8[1].insn_link.prev = pMVar11;
        local_df8[1].insn_link.next = pMVar12;
        *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar15;
        local_df8[1].ops[0].u = aVar4;
        *(undefined1 (*) [32])((long)&local_df8[1].ops[0].u + 0x10) = auVar3;
        *(ulong *)&local_df8->field_0x18 =
             *(ulong *)&local_df8->field_0x18 & 0xffffffff00000000 | 0x66;
        break;
      case MIR_LDLE:
        temp_op.data = ((anon_union_32_12_57d33f68_for_u *)(local_df8 + 1))->ref;
        temp_op._8_8_ = local_df8[1].insn_link.prev;
        ppMVar13 = &local_df8[1].insn_link.next;
        temp_op.u.i = (int64_t)*ppMVar13;
        temp_op.u.str.s = (char *)*(undefined8 *)&local_df8[1].field_0x18;
        aVar4 = *(anon_union_32_12_57d33f68_for_u *)(local_df8 + 1);
        temp_op.u._16_8_ = local_df8[1].ops[0].data;
        temp_op.u.mem.disp = *(undefined8 *)&local_df8[1].ops[0].field_0x8;
        auVar3 = *(undefined1 (*) [32])ppMVar13;
        pvVar14 = (void *)local_df8[1].ops[0].u.i;
        pMVar11 = (MIR_insn_t)local_df8[1].ops[0].u.str.s;
        pMVar12 = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
        MVar15 = local_df8[1].ops[0].u.mem.disp;
        MVar16 = local_df8[1].ops[0].u.mem.disp;
        pvVar17 = local_df8[2].data;
        pMVar18 = local_df8[2].insn_link.prev;
        local_df8[1].insn_link.next = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
        *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar16;
        local_df8[1].ops[0].data = pvVar17;
        *(MIR_insn_t *)&local_df8[1].ops[0].field_0x8 = pMVar18;
        local_df8[1].data = pvVar14;
        local_df8[1].insn_link.prev = pMVar11;
        local_df8[1].insn_link.next = pMVar12;
        *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar15;
        local_df8[1].ops[0].u = aVar4;
        *(undefined1 (*) [32])((long)&local_df8[1].ops[0].u + 0x10) = auVar3;
        *(ulong *)&local_df8->field_0x18 =
             *(ulong *)&local_df8->field_0x18 & 0xffffffff00000000 | 0x6d;
        break;
      case MIR_FBLT:
        temp_op.data = ((anon_union_32_12_57d33f68_for_u *)(local_df8 + 1))->ref;
        temp_op._8_8_ = local_df8[1].insn_link.prev;
        ppMVar13 = &local_df8[1].insn_link.next;
        temp_op.u.i = (int64_t)*ppMVar13;
        temp_op.u.str.s = (char *)*(undefined8 *)&local_df8[1].field_0x18;
        aVar4 = *(anon_union_32_12_57d33f68_for_u *)(local_df8 + 1);
        temp_op.u._16_8_ = local_df8[1].ops[0].data;
        temp_op.u.mem.disp = *(undefined8 *)&local_df8[1].ops[0].field_0x8;
        auVar3 = *(undefined1 (*) [32])ppMVar13;
        pvVar14 = (void *)local_df8[1].ops[0].u.i;
        pMVar11 = (MIR_insn_t)local_df8[1].ops[0].u.str.s;
        pMVar12 = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
        MVar15 = local_df8[1].ops[0].u.mem.disp;
        MVar16 = local_df8[1].ops[0].u.mem.disp;
        pvVar17 = local_df8[2].data;
        pMVar18 = local_df8[2].insn_link.prev;
        local_df8[1].insn_link.next = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
        *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar16;
        local_df8[1].ops[0].data = pvVar17;
        *(MIR_insn_t *)&local_df8[1].ops[0].field_0x8 = pMVar18;
        local_df8[1].data = pvVar14;
        local_df8[1].insn_link.prev = pMVar11;
        local_df8[1].insn_link.next = pMVar12;
        *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar15;
        local_df8[1].ops[0].u = aVar4;
        *(undefined1 (*) [32])((long)&local_df8[1].ops[0].u + 0x10) = auVar3;
        *(ulong *)&local_df8->field_0x18 =
             *(ulong *)&local_df8->field_0x18 & 0xffffffff00000000 | 0x97;
        break;
      case MIR_DBLT:
        temp_op.data = ((anon_union_32_12_57d33f68_for_u *)(local_df8 + 1))->ref;
        temp_op._8_8_ = local_df8[1].insn_link.prev;
        ppMVar13 = &local_df8[1].insn_link.next;
        temp_op.u.i = (int64_t)*ppMVar13;
        temp_op.u.str.s = (char *)*(undefined8 *)&local_df8[1].field_0x18;
        aVar4 = *(anon_union_32_12_57d33f68_for_u *)(local_df8 + 1);
        temp_op.u._16_8_ = local_df8[1].ops[0].data;
        temp_op.u.mem.disp = *(undefined8 *)&local_df8[1].ops[0].field_0x8;
        auVar3 = *(undefined1 (*) [32])ppMVar13;
        pvVar14 = (void *)local_df8[1].ops[0].u.i;
        pMVar11 = (MIR_insn_t)local_df8[1].ops[0].u.str.s;
        pMVar12 = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
        MVar15 = local_df8[1].ops[0].u.mem.disp;
        MVar16 = local_df8[1].ops[0].u.mem.disp;
        pvVar17 = local_df8[2].data;
        pMVar18 = local_df8[2].insn_link.prev;
        local_df8[1].insn_link.next = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
        *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar16;
        local_df8[1].ops[0].data = pvVar17;
        *(MIR_insn_t *)&local_df8[1].ops[0].field_0x8 = pMVar18;
        local_df8[1].data = pvVar14;
        local_df8[1].insn_link.prev = pMVar11;
        local_df8[1].insn_link.next = pMVar12;
        *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar15;
        local_df8[1].ops[0].u = aVar4;
        *(undefined1 (*) [32])((long)&local_df8[1].ops[0].u + 0x10) = auVar3;
        *(ulong *)&local_df8->field_0x18 =
             *(ulong *)&local_df8->field_0x18 & 0xffffffff00000000 | 0x98;
        break;
      case MIR_LDBLT:
        temp_op.data = ((anon_union_32_12_57d33f68_for_u *)(local_df8 + 1))->ref;
        temp_op._8_8_ = local_df8[1].insn_link.prev;
        ppMVar13 = &local_df8[1].insn_link.next;
        temp_op.u.i = (int64_t)*ppMVar13;
        temp_op.u.str.s = (char *)*(undefined8 *)&local_df8[1].field_0x18;
        aVar4 = *(anon_union_32_12_57d33f68_for_u *)(local_df8 + 1);
        temp_op.u._16_8_ = local_df8[1].ops[0].data;
        temp_op.u.mem.disp = *(undefined8 *)&local_df8[1].ops[0].field_0x8;
        auVar3 = *(undefined1 (*) [32])ppMVar13;
        pvVar14 = (void *)local_df8[1].ops[0].u.i;
        pMVar11 = (MIR_insn_t)local_df8[1].ops[0].u.str.s;
        pMVar12 = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
        MVar15 = local_df8[1].ops[0].u.mem.disp;
        MVar16 = local_df8[1].ops[0].u.mem.disp;
        pvVar17 = local_df8[2].data;
        pMVar18 = local_df8[2].insn_link.prev;
        local_df8[1].insn_link.next = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
        *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar16;
        local_df8[1].ops[0].data = pvVar17;
        *(MIR_insn_t *)&local_df8[1].ops[0].field_0x8 = pMVar18;
        local_df8[1].data = pvVar14;
        local_df8[1].insn_link.prev = pMVar11;
        local_df8[1].insn_link.next = pMVar12;
        *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar15;
        local_df8[1].ops[0].u = aVar4;
        *(undefined1 (*) [32])((long)&local_df8[1].ops[0].u + 0x10) = auVar3;
        *(ulong *)&local_df8->field_0x18 =
             *(ulong *)&local_df8->field_0x18 & 0xffffffff00000000 | 0x99;
        break;
      case MIR_FBLE:
        temp_op.data = ((anon_union_32_12_57d33f68_for_u *)(local_df8 + 1))->ref;
        temp_op._8_8_ = local_df8[1].insn_link.prev;
        ppMVar13 = &local_df8[1].insn_link.next;
        temp_op.u.i = (int64_t)*ppMVar13;
        temp_op.u.str.s = (char *)*(undefined8 *)&local_df8[1].field_0x18;
        aVar4 = *(anon_union_32_12_57d33f68_for_u *)(local_df8 + 1);
        temp_op.u._16_8_ = local_df8[1].ops[0].data;
        temp_op.u.mem.disp = *(undefined8 *)&local_df8[1].ops[0].field_0x8;
        auVar3 = *(undefined1 (*) [32])ppMVar13;
        pvVar14 = (void *)local_df8[1].ops[0].u.i;
        pMVar11 = (MIR_insn_t)local_df8[1].ops[0].u.str.s;
        pMVar12 = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
        MVar15 = local_df8[1].ops[0].u.mem.disp;
        MVar16 = local_df8[1].ops[0].u.mem.disp;
        pvVar17 = local_df8[2].data;
        pMVar18 = local_df8[2].insn_link.prev;
        local_df8[1].insn_link.next = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
        *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar16;
        local_df8[1].ops[0].data = pvVar17;
        *(MIR_insn_t *)&local_df8[1].ops[0].field_0x8 = pMVar18;
        local_df8[1].data = pvVar14;
        local_df8[1].insn_link.prev = pMVar11;
        local_df8[1].insn_link.next = pMVar12;
        *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar15;
        local_df8[1].ops[0].u = aVar4;
        *(undefined1 (*) [32])((long)&local_df8[1].ops[0].u + 0x10) = auVar3;
        *(ulong *)&local_df8->field_0x18 =
             *(ulong *)&local_df8->field_0x18 & 0xffffffff00000000 | 0x9e;
        break;
      case MIR_DBLE:
        temp_op.data = ((anon_union_32_12_57d33f68_for_u *)(local_df8 + 1))->ref;
        temp_op._8_8_ = local_df8[1].insn_link.prev;
        ppMVar13 = &local_df8[1].insn_link.next;
        temp_op.u.i = (int64_t)*ppMVar13;
        temp_op.u.str.s = (char *)*(undefined8 *)&local_df8[1].field_0x18;
        aVar4 = *(anon_union_32_12_57d33f68_for_u *)(local_df8 + 1);
        temp_op.u._16_8_ = local_df8[1].ops[0].data;
        temp_op.u.mem.disp = *(undefined8 *)&local_df8[1].ops[0].field_0x8;
        auVar3 = *(undefined1 (*) [32])ppMVar13;
        pvVar14 = (void *)local_df8[1].ops[0].u.i;
        pMVar11 = (MIR_insn_t)local_df8[1].ops[0].u.str.s;
        pMVar12 = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
        MVar15 = local_df8[1].ops[0].u.mem.disp;
        MVar16 = local_df8[1].ops[0].u.mem.disp;
        pvVar17 = local_df8[2].data;
        pMVar18 = local_df8[2].insn_link.prev;
        local_df8[1].insn_link.next = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
        *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar16;
        local_df8[1].ops[0].data = pvVar17;
        *(MIR_insn_t *)&local_df8[1].ops[0].field_0x8 = pMVar18;
        local_df8[1].data = pvVar14;
        local_df8[1].insn_link.prev = pMVar11;
        local_df8[1].insn_link.next = pMVar12;
        *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar15;
        local_df8[1].ops[0].u = aVar4;
        *(undefined1 (*) [32])((long)&local_df8[1].ops[0].u + 0x10) = auVar3;
        *(ulong *)&local_df8->field_0x18 =
             *(ulong *)&local_df8->field_0x18 & 0xffffffff00000000 | 0x9f;
        break;
      case MIR_LDBLE:
        temp_op.data = ((anon_union_32_12_57d33f68_for_u *)(local_df8 + 1))->ref;
        temp_op._8_8_ = local_df8[1].insn_link.prev;
        ppMVar13 = &local_df8[1].insn_link.next;
        temp_op.u.i = (int64_t)*ppMVar13;
        temp_op.u.str.s = (char *)*(undefined8 *)&local_df8[1].field_0x18;
        aVar4 = *(anon_union_32_12_57d33f68_for_u *)(local_df8 + 1);
        temp_op.u._16_8_ = local_df8[1].ops[0].data;
        temp_op.u.mem.disp = *(undefined8 *)&local_df8[1].ops[0].field_0x8;
        auVar3 = *(undefined1 (*) [32])ppMVar13;
        pvVar14 = (void *)local_df8[1].ops[0].u.i;
        pMVar11 = (MIR_insn_t)local_df8[1].ops[0].u.str.s;
        pMVar12 = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
        MVar15 = local_df8[1].ops[0].u.mem.disp;
        MVar16 = local_df8[1].ops[0].u.mem.disp;
        pvVar17 = local_df8[2].data;
        pMVar18 = local_df8[2].insn_link.prev;
        local_df8[1].insn_link.next = *(MIR_insn_t *)((long)&local_df8[1].ops[0].u + 0x10);
        *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar16;
        local_df8[1].ops[0].data = pvVar17;
        *(MIR_insn_t *)&local_df8[1].ops[0].field_0x8 = pMVar18;
        local_df8[1].data = pvVar14;
        local_df8[1].insn_link.prev = pMVar11;
        local_df8[1].insn_link.next = pMVar12;
        *(MIR_disp_t *)&local_df8[1].field_0x18 = MVar15;
        local_df8[1].ops[0].u = aVar4;
        *(undefined1 (*) [32])((long)&local_df8[1].ops[0].u + 0x10) = auVar3;
        *(ulong *)&local_df8->field_0x18 =
             *(ulong *)&local_df8->field_0x18 & 0xffffffff00000000 | 0xa0;
        break;
      default:
        switch(MVar60) {
        case MIR_RET:
          uVar75 = ((gen_ctx->curr_func_item->u).func)->nres;
          sVar63 = MIR_insn_nops(ctx,local_df8);
          if (sVar63 != uVar75) {
            __assert_fail("curr_func_item->u.func->nres == MIR_insn_nops (ctx, insn)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0x3c2,"void target_machinize(gen_ctx_t)");
          }
          pMVar79 = local_df8->ops;
          uVar75 = 0;
          uVar68 = 0;
          uVar76 = 0;
          for (uVar69 = 0; pMVar81 = (gen_ctx->curr_func_item->u).func, uVar69 < pMVar81->nres;
              uVar69 = uVar69 + 1) {
            MVar73 = pMVar81->res_types[uVar69];
            if (uVar68 < 2 && (MVar73 & ~MIR_T_U8) == MIR_T_F) {
              new_insn_code = (MVar73 != MIR_T_F) + MIR_FMOV;
              MVar58 = 0x11 - (uVar68 == 0);
              uVar68 = uVar68 + 1;
            }
            else if (uVar76 < 2 && MVar73 == MIR_T_LD) {
              new_insn_code = MIR_LDMOV;
              MVar58 = 0x21 - (uVar76 == 0);
              uVar76 = uVar76 + 1;
            }
            else {
              ctx_00 = ctx;
              if (1 < uVar75) goto LAB_00132d95;
              new_insn_code = MIR_MOV;
              bVar83 = uVar75 != 0;
              uVar75 = uVar75 + 1;
              MVar58 = (uint)bVar83 * 2;
            }
            MVar60 = new_insn_code;
            _MIR_new_var_op(ctx,MVar58);
            ret_reg_op.data = (void *)CONCAT44(uStack_cf4,mov_code1);
            ret_reg_op._9_7_ = uStack_cef;
            ret_reg_op._8_1_ = cStack_cf0;
            ret_reg_op.u._16_8_ = aStack_ce8._16_8_;
            ret_reg_op.u.mem.disp = aStack_ce8.mem.disp;
            ret_reg_op.u.i = aStack_ce8.i;
            ret_reg_op.u.str.s = aStack_ce8.str.s;
            pMVar61 = MIR_new_insn(ctx,MVar60);
            gen_add_insn_before(gen_ctx,local_df8,pMVar61);
            auVar3._8_8_ = ret_reg_op._8_8_;
            auVar3._0_8_ = ret_reg_op.data;
            auVar3._16_8_ = ret_reg_op.u.i;
            auVar3._24_8_ = ret_reg_op.u.str.s;
            aVar4.str.s = ret_reg_op.u.str.s;
            aVar4.i = ret_reg_op.u.i;
            aVar4._16_8_ = ret_reg_op.u._16_8_;
            aVar4.mem.disp = ret_reg_op.u.mem.disp;
            pMVar79->u = aVar4;
            *(undefined1 (*) [32])pMVar79 = auVar3;
            pMVar79 = pMVar79 + 1;
          }
          break;
        default:
          goto switchD_0012fb4f_caseD_10;
        case MIR_ALLOCA:
          ptVar66 = gen_ctx->target_ctx;
          ptVar66->alloca_p = '\x01';
          ptVar66->keep_fp_p = '\x01';
          break;
        case MIR_VA_ARG:
        case MIR_VA_BLOCK_ARG:
          local_e60 = (MIR_insn_t)local_df8->ops[0].data;
          uVar8 = *(undefined2 *)&local_df8->ops[0].field_0x8;
          mem_op_1.u._16_6_ = (undefined6)((ulong)local_df8->ops[0].u.mem.disp >> 0x10);
          uVar19 = *(undefined8 *)&local_df8->ops[0].field_0xa;
          uVar20 = *(undefined8 *)((long)&local_df8->ops[0].u.str.len + 2);
          uVar21 = *(undefined8 *)((long)&local_df8->ops[0].u + 10);
          uVar22 = *(undefined8 *)((long)&local_df8->ops[0].u + 0x12);
          mem_op_1.u._8_6_ = (undefined6)uVar22;
          mem_op_1.u.mem.nloc._2_2_ = (undefined2)((ulong)uVar22 >> 0x30);
          pMVar11 = (MIR_insn_t)local_df8[1].data;
          uVar9 = *(ushort *)&local_df8[1].insn_link.prev;
          uStack_ac8 = (undefined6)((ulong)*(undefined8 *)&local_df8[1].ops[0].field_0x8 >> 0x10);
          proto_item_1 = *(MIR_item_t *)((long)&local_df8[1].insn_link.prev + 2);
          uStack_ae0 = *(undefined8 *)((long)&local_df8[1].insn_link.next + 2);
          uStack_ad8 = *(undefined8 *)&local_df8[1].field_0x1a;
          uVar22 = *(undefined8 *)((long)&local_df8[1].ops[0].data + 2);
          uStack_ad0 = (undefined6)uVar22;
          uStack_aca = (undefined2)((ulong)uVar22 >> 0x30);
          local_ea0 = (MIR_insn_t)local_df8[1].ops[0].u.i;
          uVar7 = *(undefined2 *)((long)&local_df8[1].ops[0].u + 8);
          uStack_b14 = *(undefined2 *)((long)&local_df8[1].ops[0].u + 0xe);
          local_b18 = *(undefined4 *)((long)&local_df8[1].ops[0].u.mem.nonalias + 2);
          func_import_item_1 = *(MIR_item_t *)((long)&local_df8[1].ops[0].u + 0x11);
          uVar5 = *(byte *)((long)&local_df8[1].ops[0].u + 0x10);
          uStack_b70 = (undefined7)*(undefined8 *)((long)&local_df8[1].ops[0].u.mem.disp + 1);
          pMVar62 = local_df8[2].insn_link.prev;
          uStack_b69 = SUB81(local_df8[2].data,0);
          aStack_b68.i._0_7_ = (undefined7)((ulong)local_df8[2].data >> 8);
          aStack_b68.i._7_1_ = SUB81(pMVar62,0);
          aStack_b68._8_7_ = (undefined7)((ulong)pMVar62 >> 8);
          get_builtin(gen_ctx,MVar60,&proto_item,&func_import_item);
          pMVar81 = local_dc0;
          if ((((char)uVar8 != '\x02') || ((uVar9 & 0xff) != 2)) ||
             ((char)((MVar60 == MIR_VA_ARG) * '\t' + '\x02') != (char)uVar7)) {
            __assert_fail("res_reg_op.mode == MIR_OP_VAR && va_reg_op.mode == MIR_OP_VAR && op3.mode == (code == MIR_VA_ARG ? MIR_OP_VAR_MEM : MIR_OP_VAR)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0x3a0,"void target_machinize(gen_ctx_t)");
          }
          local_e68 = (MIR_item_t_conflict)CONCAT44(local_e68._4_4_,(uint)uVar9);
          MVar58 = gen_new_temp_reg(gen_ctx,MIR_T_I64,local_dc0);
          _MIR_new_var_op(ctx,MVar58);
          pcStack_e40 = (char *)CONCAT26(temp_op_1.u.mem.nloc._2_2_,temp_op_1.u._8_6_);
          local_e38 = (MIR_reg_t)temp_op_1.u._16_6_;
          uStack_e34 = (undefined4)
                       (CONCAT26(temp_op_1.u.mem.index._2_2_,temp_op_1.u._16_6_) >> 0x20);
          local_e30 = temp_op_1.u._24_8_;
          mov_code2 = (MIR_insn_code_t)temp_op_1.data;
          uStack_e54 = (undefined4)((ulong)temp_op_1.data >> 0x20);
          cStack_e50 = temp_op_1._8_1_;
          uStack_e4f = temp_op_1._9_1_;
          uStack_e4e = temp_op_1._10_6_;
          bStack_e48 = (byte)temp_op_1.u.i;
          uStack_e47 = (undefined7)((ulong)temp_op_1.u._0_8_ >> 8);
          MVar58 = gen_new_temp_reg(gen_ctx,MIR_T_I64,pMVar81);
          _MIR_new_var_op(ctx,MVar58);
          uVar22 = temp_op_1.u.mem.disp;
          pvVar14 = temp_op_1.data;
          reg_op3.u.mem.base._0_1_ = (undefined1)temp_op_1.u._16_6_;
          reg_op3.u._17_7_ =
               (undefined7)(CONCAT26(temp_op_1.u.mem.index._2_2_,temp_op_1.u._16_6_) >> 8);
          reg_op3.u.mem.disp = temp_op_1.u.mem.disp;
          reg_op3.data = temp_op_1.data;
          reg_op3._8_2_ = temp_op_1._8_2_;
          reg_op3._10_4_ = temp_op_1._10_4_;
          reg_op3._14_2_ = temp_op_1._14_2_;
          reg_op3.u.reg._0_1_ = (undefined1)temp_op_1.u.i;
          reg_op3.u.i._1_7_ = (undefined7)((ulong)temp_op_1.u._0_8_ >> 8);
          reg_op3.u.mem.nonalias._0_1_ = (undefined1)temp_op_1.u._8_6_;
          reg_op3.u._9_7_ =
               (undefined7)(CONCAT26(temp_op_1.u.mem.nloc._2_2_,temp_op_1.u._8_6_) >> 8);
          MIR_new_ref_op(ctx,func_import_item);
          pMVar62 = MIR_new_insn(ctx,MIR_MOV);
          gen_add_insn_before(gen_ctx,local_df8,pMVar62);
          if (MVar60 == MIR_VA_ARG) {
            MIR_new_int_op(ctx,(ulong)(byte)uVar5);
            pMVar61 = MIR_new_insn(ctx,MIR_MOV);
            func_import_item_1 =
                 (MIR_item_t)CONCAT17(reg_op3.u.mem.nonalias._0_1_,reg_op3.u.i._1_7_);
            local_ea0 = (MIR_insn_t)pvVar14;
            uStack_b14 = reg_op3._14_2_;
            local_b18 = reg_op3._10_4_;
            uStack_b70 = reg_op3.u._9_7_;
            uStack_b69 = reg_op3.u.mem.base._0_1_;
            aStack_b68.i._0_7_ = reg_op3.u._17_7_;
            aStack_b68.i._7_1_ = (undefined1)uVar22;
            aStack_b68._8_7_ = (undefined7)((ulong)uVar22 >> 8);
            gen_add_insn_before(gen_ctx,local_df8,pMVar61);
            uVar7 = reg_op3._8_2_;
            uVar5 = reg_op3.u.reg._0_1_;
          }
          pMVar12 = local_e60;
          MIR_new_ref_op(ctx,proto_item);
          uVar56 = uStack_ad8;
          uVar22 = uStack_ae0;
          pMVar55 = proto_item_1;
          uVar54 = uStack_b69;
          pMVar53 = func_import_item_1;
          pauVar52 = local_bc8;
          aStack_ce8._16_8_ = CONCAT26(temp_op_1.u.mem.index._2_2_,temp_op_1.u._16_6_);
          aStack_ce8.str.s = (char *)CONCAT26(temp_op_1.u.mem.nloc._2_2_,temp_op_1.u._8_6_);
          aStack_ce8.mem.disp = temp_op_1.u.mem.disp;
          mov_code1 = (MIR_insn_code_t)temp_op_1.data;
          uStack_cf4 = (undefined4)((ulong)temp_op_1.data >> 0x20);
          cStack_cf0 = temp_op_1._8_1_;
          uStack_cef = temp_op_1._9_7_;
          aStack_ce8.i = temp_op_1.u.i;
          uStack_ca8 = CONCAT44(uStack_e34,local_e38);
          local_cc8 = CONCAT44(uStack_e54,mov_code2);
          uStack_cc0 = CONCAT62(uStack_e4e,CONCAT11(uStack_e4f,cStack_e50));
          uStack_cb8 = CONCAT71(uStack_e47,bStack_e48);
          pMStack_ca0 = local_e30;
          pcStack_cb0 = pcStack_e40;
          local_c98 = pMVar12;
          uStack_c6e = mem_op_1.u._16_6_;
          auVar46._8_7_ = uStack_b70;
          auVar46._0_8_ = func_import_item_1;
          uStack_c8e = (undefined6)uVar19;
          uStack_c88 = (undefined2)((ulong)uVar19 >> 0x30);
          uStack_c86 = (undefined6)uVar20;
          uStack_c80 = (undefined2)((ulong)uVar20 >> 0x30);
          uStack_c7e = (undefined6)uVar21;
          uStack_c78 = (undefined2)((ulong)uVar21 >> 0x30);
          uVar19 = CONCAT26(uStack_aca,uStack_ad0);
          uStack_c60 = (short)local_e68;
          *(ulong *)(*local_bc8 + 0x1e) = CONCAT62(uStack_ac8,uStack_aca);
          *(MIR_item_t *)*pauVar52 = pMVar55;
          *(undefined8 *)(*pauVar52 + 8) = uVar22;
          *(undefined8 *)(*pauVar52 + 0x10) = uVar56;
          *(undefined8 *)(*pauVar52 + 0x18) = uVar19;
          auVar47._1_7_ = aStack_b68.i._0_7_;
          auVar47[0] = uStack_b69;
          auVar47[8] = aStack_b68.i._7_1_;
          auVar47._9_7_ = aStack_b68._8_7_;
          local_c38 = local_ea0;
          uStack_c2e = local_b18;
          uStack_c30 = uVar7;
          uStack_c2a = uStack_b14;
          uStack_c17 = aStack_b68.i._0_7_;
          pMStack_c10 = auVar47._8_8_;
          uStack_c27 = SUB87(pMVar53,0);
          pcStack_c20 = auVar46._7_8_;
          uStack_c18 = uVar54;
          if (MVar60 == MIR_VA_BLOCK_ARG) {
            auVar3 = *(undefined1 (*) [32])&local_df8[2].insn_link.next;
            auStack_be8 = SUB3216(*(undefined1 (*) [32])local_df8[2].ops,0x10);
            auStack_c08 = auVar3._0_16_;
            local_bf8 = auVar3._16_16_;
          }
          uStack_c90 = uVar8;
          uStack_c76 = mem_op_1.u._8_6_;
          uStack_c70 = mem_op_1.u.mem.nloc._2_2_;
          local_c68 = pMVar11;
          bStack_c28 = uVar5;
          pMVar61 = MIR_new_insn_arr(ctx,MIR_CALL,(ulong)(MVar60 != MIR_VA_ARG) + 5,
                                     (MIR_op_t *)&mov_code1);
          gen_add_insn_before(gen_ctx,local_df8,pMVar61);
          gen_delete_insn(gen_ctx,local_df8);
          break;
        case MIR_VA_START:
          MVar58 = gen_new_temp_reg(gen_ctx,MIR_T_I64,(gen_ctx->curr_func_item->u).func);
          _MIR_new_var_op(ctx,MVar58);
          if ((local_dc0->vararg_p == '\0') || (local_df8->ops[0].field_0x8 != '\x02')) {
            __assert_fail("func->vararg_p && va_op.mode == MIR_OP_VAR",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0x361,"void target_machinize(gen_ctx_t)");
          }
          MVar58 = local_df8->ops[0].u.reg;
          iVar71 = 0;
          iVar80 = 0x30;
          iVar78 = 0;
          for (uVar69 = 0; uVar69 < local_dc0->nargs; uVar69 = uVar69 + 1) {
            VARR_MIR_var_tget((MIR_var_t *)&mov_code2,local_dc0->vars,uVar69);
            if ((mov_code2 & ~MIR_FMOV) == MIR_UEXT16) {
              iVar80 = iVar80 + 0x10;
              iVar57 = iVar78 + 8;
              if (iVar71 < 0xb0) {
                iVar57 = iVar78;
              }
            }
            else if (mov_code2 == MIR_I2F) {
              iVar57 = iVar78 + 0x10;
            }
            else if (mov_code2 - MIR_D2I < 0xfffffffb) {
              iVar2 = iVar71 + 8;
              bVar83 = iVar71 < 0x28;
              iVar57 = iVar78 + 8;
              iVar71 = iVar2;
              if (bVar83) {
                iVar57 = iVar78;
              }
            }
            else {
              iVar57 = iVar78 + (int)CONCAT71(uStack_e47,bStack_e48);
            }
            iVar78 = iVar57;
          }
          _MIR_new_var_mem_op(local_758,ctx,MIR_T_U32,0,MVar58,0xffffffff,'\x01');
          MIR_new_int_op(ctx,(long)iVar71);
          pMVar61 = MIR_new_insn(gen_ctx->ctx,MIR_MOV);
          gen_add_insn_before(gen_ctx,local_df8,pMVar61);
          pMVar61 = (local_df8->insn_link).prev;
          _MIR_new_var_mem_op(local_7b8,ctx,MIR_T_U32,4,MVar58,0xffffffff,'\x01');
          MIR_new_int_op(ctx,(long)iVar80);
          pMVar64 = MIR_new_insn(gen_ctx->ctx,MIR_MOV);
          gen_add_insn_before(gen_ctx,local_df8,pMVar64);
          _MIR_new_var_op(ctx,5);
          MIR_new_int_op(ctx,(long)iVar78 + 8 + (long)gen_ctx->target_ctx->start_sp_from_bp_offset);
          pMVar64 = MIR_new_insn(ctx,MIR_ADD);
          gen_add_insn_before(gen_ctx,local_df8,pMVar64);
          _MIR_new_var_mem_op(local_878,ctx,MIR_T_I64,8,MVar58,0xffffffff,'\x01');
          pMVar64 = MIR_new_insn(gen_ctx->ctx,MIR_MOV);
          gen_add_insn_before(gen_ctx,local_df8,pMVar64);
          _MIR_new_var_op(ctx,5);
          MIR_new_int_op(ctx,-0xb0);
          pMVar64 = MIR_new_insn(ctx,MIR_ADD);
          gen_add_insn_before(gen_ctx,local_df8,pMVar64);
          _MIR_new_var_mem_op(local_908,ctx,MIR_T_I64,0x10,MVar58,0xffffffff,'\x01');
          pMVar64 = MIR_new_insn(gen_ctx->ctx,MIR_MOV);
          gen_add_insn_before(gen_ctx,local_df8,pMVar64);
          local_df8 = pMVar61;
          goto LAB_00132883;
        case MIR_VA_END:
          gen_delete_insn(gen_ctx,local_df8);
        }
      }
    } while( true );
  }
LAB_00132e8a:
  __assert_fail("curr_func_item->item_type == MIR_func_item",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0x2ba,"void target_machinize(gen_ctx_t)");
LAB_00132d95:
  p_Var67 = MIR_get_error_func(ctx_00);
  pcVar70 = "x86-64 can not handle this combination of return values";
  MVar48 = MIR_ret_error;
LAB_00132e85:
  (*p_Var67)(MVar48,pcVar70);
  goto LAB_00132e8a;
}

Assistant:

static void target_machinize (gen_ctx_t gen_ctx) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_func_t func;
  MIR_type_t type, mem_type, res_type;
  MIR_insn_code_t code, new_insn_code;
  MIR_insn_t insn, next_insn, new_insn;
  MIR_reg_t ret_reg, arg_reg;
  MIR_op_t ret_reg_op, arg_reg_op, mem_op, temp_op;
  size_t i, blk_size, int_arg_num = 0, fp_arg_num = 0, mem_size = spill_space_size;

  assert (curr_func_item->item_type == MIR_func_item);
  func = curr_func_item->u.func;
  block_arg_func_p = FALSE;
  start_sp_from_bp_offset = 8;
  keep_fp_p = func->vararg_p;
  for (i = 0; i < func->nargs; i++) {
    /* Argument extensions is already done in simplify */
    /* Prologue: generate arg_var = hard_reg|stack mem|stack addr ... */
    type = VARR_GET (MIR_var_t, func->vars, i).type;
    blk_size = MIR_blk_type_p (type) ? (VARR_GET (MIR_var_t, func->vars, i).size + 7) / 8 * 8 : 0;
#ifndef _WIN32
    if ((type == MIR_T_BLK + 1 && get_int_arg_reg (int_arg_num) != MIR_NON_VAR
         && (blk_size <= 8 || get_int_arg_reg (int_arg_num + 1) != MIR_NON_VAR))
        || (type == MIR_T_BLK + 2 && get_fp_arg_reg (fp_arg_num) != MIR_NON_VAR
            && (blk_size <= 8 || get_fp_arg_reg (fp_arg_num + 1) != MIR_NON_VAR))) {
      /* all is passed in gprs or fprs */
      MIR_type_t mov_type = type == MIR_T_BLK + 1 ? MIR_T_I64 : MIR_T_D;
      MIR_insn_code_t mov_code1, mov_code2;
      MIR_reg_t reg2, reg1 = get_arg_reg (mov_type, &int_arg_num, &fp_arg_num, &mov_code1);

      assert (blk_size <= 16);
      if (blk_size > 8) {
        reg2 = get_arg_reg (mov_type, &int_arg_num, &fp_arg_num, &mov_code2);
        new_insn = MIR_new_insn (ctx, mov_code1,
                                 _MIR_new_var_mem_op (ctx, mov_type, 8, i + MAX_HARD_REG + 1,
                                                      MIR_NON_VAR, 1),
                                 _MIR_new_var_op (ctx, reg2));
        prepend_insn (gen_ctx, new_insn);
      }
      new_insn = MIR_new_insn (ctx, mov_code1,
                               _MIR_new_var_mem_op (ctx, mov_type, 0, i + MAX_HARD_REG + 1,
                                                    MIR_NON_VAR, 1),
                               _MIR_new_var_op (ctx, reg1));
      prepend_insn (gen_ctx, new_insn);
      new_insn = MIR_new_insn (ctx, MIR_ALLOCA, _MIR_new_var_op (ctx, i + MAX_HARD_REG + 1),
                               MIR_new_int_op (ctx, blk_size));
      prepend_insn (gen_ctx, new_insn);
      continue;
    } else if ((type == MIR_T_BLK + 3 || type == MIR_T_BLK + 4)
               && get_int_arg_reg (int_arg_num) != MIR_NON_VAR
               && get_fp_arg_reg (fp_arg_num) != MIR_NON_VAR) {
      /* gpr and then fpr or fpr and then gpr */
      MIR_type_t mov_type1 = type == MIR_T_BLK + 3 ? MIR_T_I64 : MIR_T_D;
      MIR_type_t mov_type2 = type == MIR_T_BLK + 3 ? MIR_T_D : MIR_T_I64;
      MIR_insn_code_t mov_code1, mov_code2;
      MIR_reg_t reg1 = get_arg_reg (mov_type1, &int_arg_num, &fp_arg_num, &mov_code1);
      MIR_reg_t reg2 = get_arg_reg (mov_type2, &int_arg_num, &fp_arg_num, &mov_code2);

      assert (blk_size > 8 && blk_size <= 16);
      new_insn = MIR_new_insn (ctx, mov_code2,
                               _MIR_new_var_mem_op (ctx, mov_type2, 8, i + MAX_HARD_REG + 1,
                                                    MIR_NON_VAR, 1),
                               _MIR_new_var_op (ctx, reg2));
      prepend_insn (gen_ctx, new_insn);
      new_insn = MIR_new_insn (ctx, mov_code1,
                               _MIR_new_var_mem_op (ctx, mov_type1, 0, i + MAX_HARD_REG + 1,
                                                    MIR_NON_VAR, 1),
                               _MIR_new_var_op (ctx, reg1));
      prepend_insn (gen_ctx, new_insn);
      new_insn = MIR_new_insn (ctx, MIR_ALLOCA, _MIR_new_var_op (ctx, i + MAX_HARD_REG + 1),
                               MIR_new_int_op (ctx, blk_size));
      prepend_insn (gen_ctx, new_insn);
      continue;
    }
#endif
    int blk_p = MIR_blk_type_p (type);
#ifdef _WIN32
    if (blk_p && blk_size > 8) { /* just address */
      blk_p = FALSE;
      type = MIR_T_I64;
    }
#endif
    if (blk_p) {
      keep_fp_p = block_arg_func_p = TRUE;
#ifdef _WIN32
      assert (blk_size <= 8);
      if ((arg_reg = get_arg_reg (MIR_T_I64, &int_arg_num, &fp_arg_num, &new_insn_code))
          == MIR_NON_VAR) {
        new_insn
          = MIR_new_insn (ctx, MIR_ADD, _MIR_new_var_op (ctx, (MIR_reg_t) (i + MAX_HARD_REG + 1)),
                          _MIR_new_var_op (ctx, FP_HARD_REG),
                          MIR_new_int_op (ctx, mem_size + 8 /* ret */
                                                 + start_sp_from_bp_offset));
        mem_size += 8;
      } else { /* put reg into spill space and use its address: prepend in reverse order:  */
        int disp = (int) (mem_size + 8 /* ret */ + start_sp_from_bp_offset - spill_space_size
                          + 8 * get_int_arg_reg_num (arg_reg));
        new_insn
          = MIR_new_insn (ctx, MIR_ADD, _MIR_new_var_op (ctx, (MIR_reg_t) (i + MAX_HARD_REG + 1)),
                          _MIR_new_var_op (ctx, FP_HARD_REG), MIR_new_int_op (ctx, disp));
        prepend_insn (gen_ctx, new_insn);
        arg_reg_op = _MIR_new_var_op (ctx, arg_reg);
        mem_op = _MIR_new_var_mem_op (ctx, MIR_T_I64, disp, FP_HARD_REG, MIR_NON_VAR, 1);
        new_insn = MIR_new_insn (ctx, MIR_MOV, mem_op, arg_reg_op);
      }
#else
      new_insn = MIR_new_insn (ctx, MIR_ADD, _MIR_new_var_op (ctx, i + MAX_HARD_REG + 1),
                               _MIR_new_var_op (ctx, FP_HARD_REG),
                               MIR_new_int_op (ctx, mem_size + 8 /* ret addr */
                                                      + start_sp_from_bp_offset));
      mem_size += blk_size;
#endif
      prepend_insn (gen_ctx, new_insn);
    } else if ((arg_reg = get_arg_reg (type, &int_arg_num, &fp_arg_num, &new_insn_code))
               != MIR_NON_VAR) {
      arg_reg_op = _MIR_new_var_op (ctx, arg_reg);
      new_insn
        = MIR_new_insn (ctx, new_insn_code,
                        _MIR_new_var_op (ctx, (MIR_reg_t) (i + MAX_HARD_REG + 1)), arg_reg_op);
      prepend_insn (gen_ctx, new_insn);
    } else {
      /* arg is on the stack */
      keep_fp_p = block_arg_func_p = TRUE;
      mem_type = type == MIR_T_F || type == MIR_T_D || type == MIR_T_LD ? type : MIR_T_I64;
      new_insn_code = (type == MIR_T_F    ? MIR_FMOV
                       : type == MIR_T_D  ? MIR_DMOV
                       : type == MIR_T_LD ? MIR_LDMOV
                                          : MIR_MOV);
      mem_op = _MIR_new_var_mem_op (ctx, mem_type,
                                    mem_size + 8 /* ret */
                                      + start_sp_from_bp_offset,
                                    FP_HARD_REG, MIR_NON_VAR, 1);
      new_insn = MIR_new_insn (ctx, new_insn_code,
                               _MIR_new_var_op (ctx, (MIR_reg_t) (i + MAX_HARD_REG + 1)), mem_op);
      prepend_insn (gen_ctx, new_insn);
      mem_size += type == MIR_T_LD ? 16 : 8;
    }
  }
  alloca_p = FALSE;
  leaf_p = TRUE;
  for (insn = DLIST_HEAD (MIR_insn_t, func->insns); insn != NULL; insn = next_insn) {
    next_insn = DLIST_NEXT (MIR_insn_t, insn);
    code = insn->code;
    switch (code) {
    case MIR_UI2F:
    case MIR_UI2D:
    case MIR_UI2LD:
    case MIR_LD2I: {
      /* Use a builtin func call: mov freg, func ref; call proto, freg, res_reg, op_reg */
      MIR_item_t proto_item, func_import_item;
      MIR_op_t freg_op, res_reg_op = insn->ops[0], op_reg_op = insn->ops[1], ops[4];

      get_builtin (gen_ctx, code, &proto_item, &func_import_item);
      assert (res_reg_op.mode == MIR_OP_VAR && op_reg_op.mode == MIR_OP_VAR);
      freg_op
        = _MIR_new_var_op (ctx, gen_new_temp_reg (gen_ctx, MIR_T_I64, curr_func_item->u.func));
      next_insn = new_insn
        = MIR_new_insn (ctx, MIR_MOV, freg_op, MIR_new_ref_op (ctx, func_import_item));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      ops[0] = MIR_new_ref_op (ctx, proto_item);
      ops[1] = freg_op;
      ops[2] = res_reg_op;
      ops[3] = op_reg_op;
      new_insn = MIR_new_insn_arr (ctx, MIR_CALL, 4, ops);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      gen_delete_insn (gen_ctx, insn);
      break;
    }
    case MIR_VA_START: {
      MIR_op_t treg_op
        = _MIR_new_var_op (ctx, gen_new_temp_reg (gen_ctx, MIR_T_I64, curr_func_item->u.func));
      MIR_op_t va_op = insn->ops[0];
      MIR_reg_t va_reg;
#ifndef _WIN32
      int gp_offset = 0, fp_offset = 48, mem_offset = 0;
      MIR_var_t var;

      assert (func->vararg_p && va_op.mode == MIR_OP_VAR);
      for (uint32_t narg = 0; narg < func->nargs; narg++) {
        var = VARR_GET (MIR_var_t, func->vars, narg);
        if (var.type == MIR_T_F || var.type == MIR_T_D) {
          fp_offset += 16;
          if (gp_offset >= 176) mem_offset += 8;
        } else if (var.type == MIR_T_LD) {
          mem_offset += 16;
        } else if (MIR_blk_type_p (var.type)) {
          mem_offset += var.size;
        } else { /* including RBLK */
          gp_offset += 8;
          if (gp_offset >= 48) mem_offset += 8;
        }
      }
      va_reg = va_op.u.var;
      /* Insns can be not simplified as soon as they match a machine insn.  */
      /* mem32[va_reg] = gp_offset; mem32[va_reg] = fp_offset */
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_U32, 0, va_reg, MIR_NON_VAR, 1),
               MIR_new_int_op (ctx, gp_offset));
      next_insn = DLIST_PREV (MIR_insn_t, insn);
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_U32, 4, va_reg, MIR_NON_VAR, 1),
               MIR_new_int_op (ctx, fp_offset));
      /* overflow_arg_area_reg: treg = start sp + 8 + mem_offset; mem64[va_reg + 8] = treg */
      new_insn
        = MIR_new_insn (ctx, MIR_ADD, treg_op, _MIR_new_var_op (ctx, FP_HARD_REG),
                        MIR_new_int_op (ctx, 8 /*ret*/ + mem_offset + start_sp_from_bp_offset));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_I64, 8, va_reg, MIR_NON_VAR, 1), treg_op);
      /* reg_save_area: treg = start sp - reg_save_area_size; mem64[va_reg + 16] = treg */
      new_insn = MIR_new_insn (ctx, MIR_ADD, treg_op, _MIR_new_var_op (ctx, FP_HARD_REG),
                               MIR_new_int_op (ctx, -reg_save_area_size));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_I64, 16, va_reg, MIR_NON_VAR, 1), treg_op);
#else
      /* init va_list */
      mem_size = 8 /*ret*/ + start_sp_from_bp_offset + func->nargs * 8;
      new_insn = MIR_new_insn (ctx, MIR_ADD, treg_op, _MIR_new_var_op (ctx, FP_HARD_REG),
                               MIR_new_int_op (ctx, mem_size));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      va_reg = va_op.u.var;
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_I64, 0, va_reg, MIR_NON_VAR, 1), treg_op);
#endif
      gen_delete_insn (gen_ctx, insn);
      break;
    }
    case MIR_VA_END: /* do nothing */ gen_delete_insn (gen_ctx, insn); break;
    case MIR_VA_ARG:
    case MIR_VA_BLOCK_ARG: {
      /* Use a builtin func call:
         mov func_reg, func ref; [mov reg3, type;] call proto, func_reg, res_reg, va_reg,
         reg3 */
      MIR_item_t proto_item, func_import_item;
      MIR_op_t ops[6], func_reg_op, reg_op3;
      MIR_op_t res_reg_op = insn->ops[0], va_reg_op = insn->ops[1], op3 = insn->ops[2];

      get_builtin (gen_ctx, code, &proto_item, &func_import_item);
      assert (res_reg_op.mode == MIR_OP_VAR && va_reg_op.mode == MIR_OP_VAR
              && op3.mode == (code == MIR_VA_ARG ? MIR_OP_VAR_MEM : MIR_OP_VAR));
      func_reg_op = _MIR_new_var_op (ctx, gen_new_temp_reg (gen_ctx, MIR_T_I64, func));
      reg_op3 = _MIR_new_var_op (ctx, gen_new_temp_reg (gen_ctx, MIR_T_I64, func));
      next_insn = new_insn
        = MIR_new_insn (ctx, MIR_MOV, func_reg_op, MIR_new_ref_op (ctx, func_import_item));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      if (code == MIR_VA_ARG) {
        new_insn = MIR_new_insn (ctx, MIR_MOV, reg_op3,
                                 MIR_new_int_op (ctx, (int64_t) op3.u.var_mem.type));
        op3 = reg_op3;
        gen_add_insn_before (gen_ctx, insn, new_insn);
      }
      ops[0] = MIR_new_ref_op (ctx, proto_item);
      ops[1] = func_reg_op;
      ops[2] = res_reg_op;
      ops[3] = va_reg_op;
      ops[4] = op3;
      if (code == MIR_VA_BLOCK_ARG) ops[5] = insn->ops[3];
      new_insn = MIR_new_insn_arr (ctx, MIR_CALL, code == MIR_VA_ARG ? 5 : 6, ops);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      gen_delete_insn (gen_ctx, insn);
      break;
    }
    case MIR_ALLOCA: keep_fp_p = alloca_p = TRUE; break;
    case MIR_RET: {
      /* In simplify we already transformed code for one return insn
         and added extension in return (if any).  */
      uint32_t n_iregs = 0, n_xregs = 0, n_fregs = 0;

#ifdef _WIN32
      if (curr_func_item->u.func->nres > 1)
        (*MIR_get_error_func (ctx)) (MIR_ret_error,
                                     "Windows x86-64 doesn't support multiple return values");
#endif
      assert (curr_func_item->u.func->nres == MIR_insn_nops (ctx, insn));
      for (size_t nres = 0; nres < curr_func_item->u.func->nres; nres++) {
        res_type = curr_func_item->u.func->res_types[nres];
        if ((res_type == MIR_T_F || res_type == MIR_T_D) && n_xregs < 2) {
          new_insn_code = res_type == MIR_T_F ? MIR_FMOV : MIR_DMOV;
          ret_reg = n_xregs++ == 0 ? XMM0_HARD_REG : XMM1_HARD_REG;
        } else if (res_type == MIR_T_LD && n_fregs < 2) {  // ???
          new_insn_code = MIR_LDMOV;
          ret_reg = n_fregs == 0 ? ST0_HARD_REG : ST1_HARD_REG;
          n_fregs++;
        } else if (n_iregs < 2) {
          new_insn_code = MIR_MOV;
          ret_reg = n_iregs++ == 0 ? AX_HARD_REG : DX_HARD_REG;
        } else {
          (*MIR_get_error_func (ctx)) (MIR_ret_error,
                                       "x86-64 can not handle this combination of return values");
        }
        ret_reg_op = _MIR_new_var_op (ctx, ret_reg);
        new_insn = MIR_new_insn (ctx, new_insn_code, ret_reg_op, insn->ops[nres]);
        gen_add_insn_before (gen_ctx, insn, new_insn);
        insn->ops[nres] = ret_reg_op;
      }
      break;
    }
    case MIR_LSH:
    case MIR_RSH:
    case MIR_URSH:
    case MIR_LSHS:
    case MIR_RSHS:
    case MIR_URSHS: {
      /* We can access only cl as shift register: */
      MIR_op_t creg_op = _MIR_new_var_op (ctx, CX_HARD_REG);

      new_insn = MIR_new_insn (ctx, MIR_MOV, creg_op, insn->ops[2]);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      insn->ops[2] = creg_op;
      break;
    }
    case MIR_UMULO:
    case MIR_UMULOS: {
      /* We can use only ax as zero and the 1st operand: */
      MIR_op_t areg_op = _MIR_new_var_op (ctx, AX_HARD_REG);

      new_insn = MIR_new_insn (ctx, MIR_MOV, areg_op, insn->ops[1]);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      new_insn = MIR_new_insn (ctx, MIR_MOV, insn->ops[0], areg_op);
      gen_add_insn_after (gen_ctx, insn, new_insn);
      insn->ops[0] = insn->ops[1] = areg_op;
      break;
    }
    case MIR_DIV:
    case MIR_UDIV:
    case MIR_DIVS:
    case MIR_UDIVS: {
      /* Divide uses ax/dx as operands: */
      MIR_op_t areg_op = _MIR_new_var_op (ctx, AX_HARD_REG);

      new_insn = MIR_new_insn (ctx, MIR_MOV, areg_op, insn->ops[1]);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      new_insn = MIR_new_insn (ctx, MIR_MOV, insn->ops[0], areg_op);
      gen_add_insn_after (gen_ctx, insn, new_insn);
      insn->ops[0] = insn->ops[1] = areg_op;
      break;
    }
    case MIR_MOD:
    case MIR_UMOD:
    case MIR_MODS:
    case MIR_UMODS: {
      /* Divide uses ax/dx as operands: */
      MIR_op_t areg_op = _MIR_new_var_op (ctx, AX_HARD_REG);
      MIR_op_t dreg_op = _MIR_new_var_op (ctx, DX_HARD_REG);

      new_insn = MIR_new_insn (ctx, MIR_MOV, areg_op, insn->ops[1]);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      insn->ops[1] = areg_op;
      new_insn = MIR_new_insn (ctx, MIR_MOV, insn->ops[0], dreg_op);
      gen_add_insn_after (gen_ctx, insn, new_insn);
      insn->ops[0] = dreg_op;
      break;
    }
    case MIR_EQ:
    case MIR_NE:
    case MIR_LT:
    case MIR_ULT:
    case MIR_LE:
    case MIR_ULE:
    case MIR_GT:
    case MIR_UGT:
    case MIR_GE:
    case MIR_UGE:
    case MIR_EQS:
    case MIR_NES:
    case MIR_LTS:
    case MIR_ULTS:
    case MIR_LES:
    case MIR_ULES:
    case MIR_GTS:
    case MIR_UGTS:
    case MIR_GES:
    case MIR_UGES:
    case MIR_FEQ:
    case MIR_FNE:
    case MIR_FLT:
    case MIR_FLE:
    case MIR_FGT:
    case MIR_FGE:
    case MIR_DEQ:
    case MIR_DNE:
    case MIR_DLT:
    case MIR_DLE:
    case MIR_DGT:
    case MIR_DGE: {
      new_insn = MIR_new_insn (ctx, MIR_UEXT8, insn->ops[0], insn->ops[0]);
      gen_add_insn_after (gen_ctx, insn, new_insn);
      /* Following conditional branches are changed to correctly process unordered numbers: */
      switch (code) {
      case MIR_FLT:
        SWAP (insn->ops[1], insn->ops[2], temp_op);
        insn->code = MIR_FGT;
        break;
      case MIR_FLE:
        SWAP (insn->ops[1], insn->ops[2], temp_op);
        insn->code = MIR_FGE;
        break;
      case MIR_DLT:
        SWAP (insn->ops[1], insn->ops[2], temp_op);
        insn->code = MIR_DGT;
        break;
      case MIR_DLE:
        SWAP (insn->ops[1], insn->ops[2], temp_op);
        insn->code = MIR_DGE;
        break;
      default: break; /* do nothing */
      }
      break;
    }
    /* Following conditional branches are changed to correctly process unordered numbers: */
    case MIR_LDLT:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_LDGT;
      break;
    case MIR_LDLE:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_LDGE;
      break;
    case MIR_FBLT:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_FBGT;
      break;
    case MIR_FBLE:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_FBGE;
      break;
    case MIR_DBLT:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_DBGT;
      break;
    case MIR_DBLE:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_DBGE;
      break;
    case MIR_LDBLT:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_LDBGT;
      break;
    case MIR_LDBLE:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_LDBGE;
      break;
    default:
      if (MIR_call_code_p (code)) {
        machinize_call (gen_ctx, insn);
        leaf_p = FALSE;
      }
      break;
    }
  }
}